

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hydro_godunov_extrap_vel_to_faces_3D.cpp
# Opt level: O1

void Godunov::ExtrapVelToFacesOnBox
               (Box *bx,int ncomp,Box *xbx,Box *ybx,Box *zbx,Array4<double> *qx,Array4<double> *qy,
               Array4<double> *qz,Array4<const_double> *q,Array4<const_double> *u_ad,
               Array4<const_double> *v_ad,Array4<const_double> *w_ad,Array4<double> *Imx,
               Array4<double> *Imy,Array4<double> *Imz,Array4<double> *Ipx,Array4<double> *Ipy,
               Array4<double> *Ipz,Array4<const_double> *f,Box *domain,Real *dx_arr,Real l_dt,
               BCRec *pbc,bool l_use_forces_in_trans,Real *p)

{
  double *pdVar1;
  double *pdVar2;
  double *pdVar3;
  double *pdVar4;
  double dVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  double *pdVar20;
  long lVar21;
  long lVar22;
  double *pdVar23;
  long lVar24;
  long lVar25;
  double *pdVar26;
  long lVar27;
  undefined8 uVar28;
  undefined8 uVar29;
  long lVar30;
  int iVar31;
  int i;
  int iVar32;
  int iVar33;
  int iVar34;
  long lVar35;
  long lVar36;
  long lVar37;
  long lVar38;
  long lVar39;
  long lVar40;
  long lVar41;
  long lVar42;
  long lVar43;
  long lVar44;
  long lVar45;
  long lVar46;
  long lVar47;
  int iVar48;
  int iVar49;
  int iVar50;
  long lVar51;
  long lVar52;
  long lVar53;
  double *pdVar54;
  long lVar55;
  long lVar56;
  int iVar57;
  long lVar58;
  long lVar59;
  long lVar60;
  long lVar61;
  long lVar62;
  long lVar63;
  long lVar64;
  long lVar65;
  long lVar66;
  long lVar67;
  long lVar68;
  long lVar69;
  long lVar70;
  long lVar71;
  long lVar72;
  long lVar73;
  long lVar74;
  long lVar75;
  long lVar76;
  long lVar77;
  int iVar78;
  long lVar79;
  long lVar80;
  long lVar81;
  int iVar82;
  double *pdVar83;
  double *pdVar84;
  long lVar85;
  long lVar86;
  int iVar87;
  long lVar88;
  long lVar89;
  long lVar90;
  int iVar91;
  long lVar92;
  long lVar93;
  long lVar94;
  long lVar95;
  long lVar96;
  double *pdVar97;
  int iVar98;
  long lVar99;
  long lVar100;
  long lVar101;
  int iVar102;
  double *pdVar103;
  long lVar104;
  long lVar105;
  long lVar106;
  Real *pRVar107;
  double *pdVar108;
  int iVar109;
  long lVar110;
  int iVar111;
  int iVar112;
  long lVar113;
  long lVar114;
  int iVar115;
  Real *pRVar116;
  long lVar117;
  long lVar118;
  bool bVar119;
  ulong uVar120;
  ulong uVar121;
  ulong uVar122;
  double dVar123;
  double dVar124;
  double dVar125;
  double dVar126;
  double dVar127;
  ulong local_4b8;
  double *local_4b0;
  double *local_4a8;
  double *local_4a0;
  double *local_490;
  double *local_480;
  long local_478;
  double *local_470;
  long local_468;
  long local_460;
  Real *local_450;
  double *local_448;
  Real *local_440;
  double *local_430;
  double *local_428;
  double *local_420;
  double *local_418;
  double *local_410;
  Real *local_408;
  double *local_3d8;
  Real *local_3c8;
  double *local_3a0;
  long local_2c0;
  long local_2a0;
  double *local_270;
  long local_268;
  long local_260;
  long local_218;
  int local_1b8;
  int iStack_1b4;
  int iStack_1b0;
  int aiStack_1ac [2];
  undefined8 uStack_1a4;
  double *local_198;
  Real local_190;
  long local_188;
  double *local_180;
  long local_178;
  int local_16c;
  long local_168;
  Real local_160;
  long local_158;
  double *local_150;
  long local_148;
  long local_140;
  long local_138;
  long local_130;
  Box *local_128;
  Real local_120;
  long local_118;
  long local_110;
  long local_108;
  long local_100;
  long local_f8;
  long local_f0;
  double *local_e8;
  long local_e0;
  long local_d8;
  long local_d0;
  double *local_c8;
  long local_c0;
  long local_b8;
  double *local_b0;
  long local_a8;
  long local_a0;
  long local_98;
  long local_90;
  Box *local_88;
  long local_80;
  long local_78;
  long local_70;
  long local_68;
  long local_60;
  Array4<double> *local_58;
  Box *local_50;
  Real local_48;
  
  iVar102 = (domain->smallend).vect[0];
  lVar58 = (long)iVar102;
  iVar6 = (domain->smallend).vect[1];
  lVar59 = (long)iVar6;
  local_160 = *dx_arr;
  local_120 = dx_arr[1];
  local_190 = dx_arr[2];
  iVar98 = (bx->bigend).vect[1];
  uVar7 = (bx->btype).itype;
  iVar57 = iVar98 + 1;
  iVar91 = iVar98;
  if ((uVar7 & 2) == 0) {
    iVar91 = iVar57;
  }
  iVar8 = (domain->smallend).vect[2];
  iVar50 = (domain->bigend).vect[2];
  iVar9 = (domain->bigend).vect[0];
  lVar51 = (long)iVar9;
  iVar10 = (domain->bigend).vect[1];
  lVar35 = (long)iVar10;
  iVar109 = (bx->bigend).vect[2];
  iVar34 = iVar109 + 1;
  iVar115 = iVar109;
  if ((uVar7 & 4) == 0) {
    iVar115 = iVar34;
  }
  iVar98 = iVar98 + 2;
  iVar78 = (bx->bigend).vect[0];
  iVar48 = (~uVar7 & 1) + iVar78 + 1;
  lVar60 = (long)iVar48;
  iVar87 = (bx->smallend).vect[0];
  lVar92 = (long)iVar87;
  iVar48 = iVar48 - iVar87;
  lVar52 = (long)iVar48;
  iVar112 = (bx->smallend).vect[2];
  local_168 = (long)iVar112;
  lVar36 = (long)((iVar109 - iVar112) + 3);
  iVar109 = (bx->smallend).vect[1];
  lVar88 = (long)iVar109;
  lVar37 = (long)((iVar91 + 1) - iVar109);
  iVar49 = iVar87 + -1;
  iVar32 = iVar78 + 2;
  iVar33 = iVar32 - iVar49;
  lVar38 = (long)iVar33;
  iVar82 = iVar109 + -1;
  lVar39 = (long)(iVar98 - iVar82);
  local_178 = (long)((iVar115 - iVar112) + 1);
  local_c8 = Imx->p;
  local_148 = Imx->jstride;
  local_110 = Imx->kstride;
  local_d8 = Imx->nstride;
  local_d0 = (long)(Imx->begin).x;
  local_e0 = (long)(Imx->begin).y;
  local_118 = (long)(Imx->begin).z;
  local_b0 = Imy->p;
  local_130 = Imy->jstride;
  local_100 = Imy->kstride;
  local_98 = Imy->nstride;
  local_b8 = (long)(Imy->begin).x;
  local_c0 = (long)(Imy->begin).y;
  local_108 = (long)(Imy->begin).z;
  local_e8 = Imz->p;
  lVar45 = Imz->jstride;
  lVar47 = Imz->kstride;
  local_a0 = Imz->nstride;
  local_f0 = (long)(Imz->begin).x;
  local_f8 = (long)(Imz->begin).y;
  lVar40 = (long)(Imz->begin).z;
  iVar111 = iVar112 + -1;
  lVar53 = (long)ncomp;
  local_180 = Ipx->p;
  local_150 = f->p;
  lVar43 = f->jstride;
  lVar44 = f->kstride;
  local_90 = (long)(f->begin).x;
  local_158 = (long)(f->begin).y;
  lVar61 = (long)(f->begin).z;
  pdVar20 = q->p;
  lVar21 = q->jstride;
  lVar22 = q->kstride;
  uVar11 = (q->begin).x;
  lVar62 = (long)(int)uVar11;
  uVar12 = (q->begin).y;
  lVar63 = (long)(int)uVar12;
  uVar13 = (q->begin).z;
  lVar64 = (long)(int)uVar13;
  local_198 = Ipy->p;
  pdVar23 = v_ad->p;
  lVar24 = v_ad->jstride;
  lVar25 = v_ad->kstride;
  local_138 = (long)(v_ad->begin).x;
  local_140 = (long)(v_ad->begin).y;
  lVar65 = (long)(v_ad->begin).z;
  pdVar26 = Ipz->p;
  pdVar97 = w_ad->p;
  lVar27 = w_ad->jstride;
  lVar46 = w_ad->kstride;
  lVar66 = (long)(w_ad->begin).x;
  lVar67 = (long)(w_ad->begin).y;
  lVar68 = (long)(w_ad->begin).z;
  lVar69 = (long)iVar82;
  lVar70 = (long)iVar111;
  if (0 < ncomp) {
    lVar93 = Ipx->jstride;
    lVar117 = Ipx->kstride;
    lVar99 = Ipx->nstride;
    iVar14 = (Ipx->begin).z;
    lVar55 = u_ad->jstride;
    iVar15 = (u_ad->begin).y;
    iVar16 = (u_ad->begin).x;
    local_60 = lVar53 * lVar36;
    dVar123 = l_dt * 0.5;
    lVar89 = lVar52 * lVar39;
    pdVar84 = u_ad->p;
    lVar86 = u_ad->kstride;
    iVar17 = (u_ad->begin).z;
    local_420 = local_c8 + (((lVar69 - local_e0) * local_148 + lVar92) - local_d0);
    local_a8 = local_90 * 8;
    local_418 = local_150 + (((lVar69 - local_158) * lVar43 + lVar92 + -1) - local_90);
    lVar42 = f->nstride;
    lVar71 = -lVar61;
    local_3a0 = local_180 +
                (((lVar69 - (Ipx->begin).y) * lVar93 + lVar92 + -1) - (long)(Ipx->begin).x);
    lVar56 = q->nstride;
    lVar76 = Ipy->jstride;
    lVar77 = Ipy->kstride;
    lVar80 = Ipy->nstride;
    local_68 = (long)(Ipy->begin).x;
    local_70 = (long)(Ipy->begin).y;
    iVar18 = (Ipy->begin).z;
    lVar94 = Ipz->jstride;
    lVar100 = Ipz->kstride;
    lVar101 = Ipz->nstride;
    local_78 = (long)(Ipz->begin).x;
    local_80 = (long)(Ipz->begin).y;
    iVar19 = (Ipz->begin).z;
    uVar122 = (ulong)(uint)ncomp;
    lVar41 = lVar44 * 8;
    local_4b8 = 0;
    local_408 = p;
    do {
      if (iVar111 <= iVar34) {
        iVar31 = iVar111;
        do {
          if (iVar82 <= iVar57) {
            lVar72 = (long)iVar31;
            pRVar107 = (Real *)((local_60 * 8 + lVar70 * -8 + lVar72 * 8) * lVar89 + (long)local_408
                               );
            pRVar116 = (Real *)((-lVar70 + lVar72) * lVar89 * 8 + (long)local_408);
            lVar79 = (long)pdVar84 +
                     (lVar72 - iVar17) * lVar86 * 8 +
                     lVar92 * 8 + (lVar69 - iVar15) * lVar55 * 8 + (long)iVar16 * -8;
            pdVar103 = (double *)((lVar72 - local_118) * local_110 * 8 + (long)local_420);
            pdVar83 = (double *)((lVar71 + lVar72) * lVar41 + (long)local_418);
            pdVar54 = (double *)((lVar72 - iVar14) * lVar117 * 8 + (long)local_3a0);
            lVar73 = (int)(iVar31 - uVar13) * lVar22;
            lVar72 = lVar69;
            do {
              if (iVar87 <= (int)((~uVar7 & 1) + iVar78)) {
                lVar74 = (lVar72 - lVar63) * lVar21;
                lVar75 = 0;
                do {
                  dVar124 = pdVar54[lVar75];
                  dVar125 = pdVar103[lVar75];
                  if (l_use_forces_in_trans) {
                    dVar124 = dVar124 + pdVar83[lVar75] * dVar123;
                    dVar125 = dVar125 + (pdVar83 + lVar75)[1] * dVar123;
                  }
                  if (lVar58 < lVar92 + lVar75) {
                    if (lVar51 < lVar92 + lVar75) {
                      switch(pbc[local_4b8].bc[3]) {
                      case 1:
                      case 2:
                      case 4:
switchD_003a4592_caseD_1:
                        dVar125 = dVar124;
                        break;
                      case 3:
                        dVar125 = pdVar20[lVar74 + (long)(int)((iVar9 - uVar11) + 1) +
                                                   lVar73 + local_4b8 * lVar56];
                        if (local_4b8 == 0) goto switchD_003a45ae_caseD_1;
                        break;
                      case -1:
                        goto switchD_003a4592_caseD_ffffffff;
                      }
                    }
                  }
                  else {
                    switch(pbc[local_4b8].bc[0]) {
                    case 1:
                    case 2:
                    case 4:
switchD_003a45ae_caseD_1:
                      dVar124 = dVar125;
                      dVar125 = dVar124;
                      break;
                    case 3:
                      dVar124 = pdVar20[lVar74 + (long)(int)(~uVar11 + iVar102) +
                                                 lVar73 + local_4b8 * lVar56];
                      if (local_4b8 == 0) goto switchD_003a4592_caseD_1;
                      break;
                    case -1:
switchD_003a4592_caseD_ffffffff:
                      dVar125 = 0.0;
                      dVar124 = 0.0;
                    }
                  }
                  dVar126 = *(double *)(lVar79 + lVar75 * 8);
                  pRVar116[lVar75] = dVar124;
                  pRVar107[lVar75] = dVar125;
                  uVar120 = -(ulong)(0.0 <= dVar126);
                  dVar126 = (double)(~-(ulong)(ABS(dVar126) < 1e-08) & 0x3ff0000000000000);
                  pdVar103[lVar75] =
                       dVar126 * (double)(~uVar120 & (ulong)dVar125 | uVar120 & (ulong)dVar124) +
                       (dVar125 + dVar124) * (1.0 - dVar126) * 0.5;
                  lVar75 = lVar75 + 1;
                } while (iVar48 != (int)lVar75);
              }
              lVar72 = lVar72 + 1;
              pRVar107 = pRVar107 + (lVar60 - lVar92);
              pRVar116 = pRVar116 + (lVar60 - lVar92);
              lVar79 = lVar79 + lVar55 * 8;
              pdVar103 = pdVar103 + local_148;
              pdVar83 = pdVar83 + lVar43;
              pdVar54 = pdVar54 + lVar93;
            } while (iVar98 != (int)lVar72);
          }
          bVar119 = iVar31 != iVar34;
          iVar31 = iVar31 + 1;
        } while (bVar119);
      }
      local_4b8 = local_4b8 + 1;
      local_408 = local_408 + lVar89 * lVar36;
      local_420 = local_420 + local_d8;
      local_418 = local_418 + lVar42;
      local_3a0 = local_3a0 + lVar99;
    } while (local_4b8 != uVar122);
    local_188 = lVar101;
    if (0 < ncomp) {
      lVar93 = (long)iVar49;
      local_428 = local_150 + (((lVar88 - local_158) * lVar43 + lVar93) - local_90);
      local_430 = local_150 + ((((lVar88 + -1) - local_158) * lVar43 + lVar93) - local_90);
      local_448 = pdVar20 + (((int)((iVar10 - uVar12) + 1) * lVar21 + lVar93) - lVar62);
      lVar117 = lVar38 * lVar37;
      local_418 = pdVar20 + (((int)(~uVar12 + iVar6) * lVar21 + lVar93) - lVar62);
      local_450 = (Real *)((lVar89 * 0x10 + lVar117 * 8) * local_60 + (long)p);
      local_440 = p + lVar89 * local_60 * 2;
      local_490 = local_b0 + (((lVar88 - local_c0) * local_130 + lVar93) - local_b8);
      local_480 = local_198 + ((((lVar88 - local_70) + -1) * lVar76 + lVar93) - local_68);
      uVar120 = 0;
      do {
        iVar87 = iVar111;
        if (iVar111 <= iVar34) {
          do {
            if (iVar109 <= iVar91) {
              lVar72 = (long)iVar87;
              lVar99 = (lVar71 + lVar72) * lVar41;
              pdVar84 = (double *)((long)local_428 + lVar99);
              pdVar83 = (double *)(lVar99 + (long)local_430);
              lVar86 = (lVar72 - lVar64) * lVar22 * 8;
              lVar99 = (-lVar70 + lVar72) * lVar117 * 8;
              pRVar107 = (Real *)((long)local_450 + lVar99);
              pRVar116 = (Real *)(lVar99 + (long)local_440);
              lVar55 = (long)pdVar23 +
                       (lVar72 - lVar65) * lVar25 * 8 +
                       lVar93 * 8 + (lVar88 - local_140) * lVar24 * 8 + local_138 * -8;
              pdVar103 = (double *)((lVar72 - local_108) * local_100 * 8 + (long)local_490);
              pdVar54 = (double *)((lVar72 - iVar18) * lVar77 * 8 + (long)local_480);
              lVar99 = lVar88;
              do {
                if (iVar49 <= iVar78 + 1) {
                  lVar72 = 0;
                  do {
                    dVar124 = pdVar54[lVar72];
                    dVar125 = pdVar103[lVar72];
                    if (l_use_forces_in_trans) {
                      dVar124 = dVar124 + pdVar83[lVar72] * dVar123;
                      dVar125 = dVar125 + pdVar84[lVar72] * dVar123;
                    }
                    if (lVar59 < lVar99) {
                      if (lVar35 < lVar99) {
                        switch(pbc[uVar120].bc[4]) {
                        case 1:
                        case 2:
                        case 4:
switchD_003a4bdc_caseD_1:
                          dVar125 = dVar124;
                          dVar124 = dVar125;
                          break;
                        case 3:
                          dVar125 = *(double *)((long)local_448 + lVar72 * 8 + lVar86);
                          if (uVar120 == 1) goto switchD_003a4c0a_caseD_1;
                          break;
                        case -1:
                          goto switchD_003a4bdc_caseD_ffffffff;
                        }
                      }
                    }
                    else {
                      switch(pbc[uVar120].bc[1]) {
                      case 1:
                      case 2:
                      case 4:
switchD_003a4c0a_caseD_1:
                        dVar124 = dVar125;
                        break;
                      case 3:
                        dVar124 = *(double *)((long)local_418 + lVar72 * 8 + lVar86);
                        if (uVar120 == 1) goto switchD_003a4bdc_caseD_1;
                        break;
                      case -1:
switchD_003a4bdc_caseD_ffffffff:
                        dVar125 = 0.0;
                        dVar124 = 0.0;
                      }
                    }
                    dVar126 = *(double *)(lVar55 + lVar72 * 8);
                    pRVar116[lVar72] = dVar124;
                    pRVar107[lVar72] = dVar125;
                    uVar121 = -(ulong)(0.0 <= dVar126);
                    dVar126 = (double)(~-(ulong)(ABS(dVar126) < 1e-08) & 0x3ff0000000000000);
                    pdVar103[lVar72] =
                         dVar126 * (double)(~uVar121 & (ulong)dVar125 | uVar121 & (ulong)dVar124) +
                         (dVar125 + dVar124) * (1.0 - dVar126) * 0.5;
                    lVar72 = lVar72 + 1;
                  } while (iVar33 != (int)lVar72);
                }
                lVar99 = lVar99 + 1;
                pdVar84 = pdVar84 + lVar43;
                pdVar83 = pdVar83 + lVar43;
                pRVar107 = pRVar107 + (iVar32 - lVar93);
                pRVar116 = pRVar116 + (iVar32 - lVar93);
                lVar55 = lVar55 + lVar24 * 8;
                pdVar103 = pdVar103 + local_130;
                pdVar54 = pdVar54 + lVar76;
              } while (iVar91 + 1 != (int)lVar99);
            }
            bVar119 = iVar87 != iVar34;
            iVar87 = iVar87 + 1;
          } while (bVar119);
        }
        uVar120 = uVar120 + 1;
        local_428 = local_428 + lVar42;
        local_430 = local_430 + lVar42;
        local_448 = local_448 + lVar56;
        local_418 = local_418 + lVar56;
        local_450 = local_450 + lVar117 * lVar36;
        local_440 = local_440 + lVar117 * lVar36;
        local_490 = local_490 + local_98;
        local_480 = local_480 + lVar80;
      } while (uVar120 != uVar122);
      if (0 < ncomp) {
        lVar55 = (long)iVar82;
        local_3d8 = local_150 + (((lVar55 - local_158) * lVar43 + lVar93) - local_90);
        lVar99 = (lVar55 - lVar63) * lVar21;
        local_430 = pdVar20 + ((lVar93 + lVar99 + (int)((iVar50 - uVar13) + 1) * lVar22) - lVar62);
        local_448 = pdVar20 + ((lVar93 + lVar99 + (int)(~uVar13 + iVar8) * lVar22) - lVar62);
        lVar99 = lVar39 * lVar38 * local_178;
        lVar117 = (lVar89 * 0x10 + lVar117 * 0x10) * lVar36;
        local_450 = (Real *)((lVar117 + lVar99 * 8) * lVar53 + (long)p);
        local_3c8 = (Real *)(lVar117 * lVar53 + (long)p);
        local_490 = local_e8 + (((lVar55 - local_f8) * lVar45 + lVar93) - local_f0);
        local_410 = pdVar26 + (((lVar55 - local_80) * lVar94 + lVar93) - local_78);
        local_188 = lVar101 * 8;
        local_4b0 = (double *)0x0;
        do {
          iVar34 = iVar112;
          iVar91 = iVar111;
          if (iVar112 <= iVar115) {
            do {
              if (iVar82 <= iVar57) {
                lVar86 = (long)iVar34;
                pdVar54 = (double *)((lVar71 + lVar86) * lVar41 + (long)local_3d8);
                pdVar103 = (double *)((lVar71 + iVar91) * lVar41 + (long)local_3d8);
                lVar117 = (lVar86 - local_168) * lVar39 * lVar38 * 8;
                pRVar107 = (Real *)((long)local_450 + lVar117);
                pRVar116 = (Real *)(lVar117 + (long)local_3c8);
                lVar117 = (long)pdVar97 +
                          (lVar86 - lVar68) * lVar46 * 8 +
                          lVar93 * 8 + (lVar55 - lVar67) * lVar27 * 8 + lVar66 * -8;
                pdVar108 = (double *)((lVar86 - lVar40) * lVar47 * 8 + (long)local_490);
                pdVar83 = (double *)(((long)iVar91 - (long)iVar19) * lVar100 * 8 + (long)local_410);
                local_470 = local_430;
                pdVar84 = local_448;
                local_460 = lVar55;
                do {
                  if (iVar49 <= iVar78 + 1) {
                    lVar86 = 0;
                    do {
                      dVar124 = pdVar83[lVar86];
                      dVar125 = pdVar108[lVar86];
                      if (l_use_forces_in_trans) {
                        dVar124 = dVar124 + pdVar103[lVar86] * dVar123;
                        dVar125 = dVar125 + pdVar54[lVar86] * dVar123;
                      }
                      if (iVar8 < iVar34) {
                        if (iVar50 < iVar34) {
                          switch(pbc[(long)local_4b0].bc[5]) {
                          case 1:
                          case 2:
                          case 4:
switchD_003a51d7_caseD_1:
                            dVar125 = dVar124;
                            dVar124 = dVar125;
                            break;
                          case 3:
                            dVar125 = local_470[lVar86];
                            if (local_4b0 == (double *)0x2) goto switchD_003a5204_caseD_1;
                            break;
                          case -1:
                            goto switchD_003a51d7_caseD_ffffffff;
                          }
                        }
                      }
                      else {
                        switch(pbc[(long)local_4b0].bc[2]) {
                        case 1:
                        case 2:
                        case 4:
switchD_003a5204_caseD_1:
                          dVar124 = dVar125;
                          break;
                        case 3:
                          dVar124 = pdVar84[lVar86];
                          if (local_4b0 == (double *)0x2) goto switchD_003a51d7_caseD_1;
                          break;
                        case -1:
switchD_003a51d7_caseD_ffffffff:
                          dVar125 = 0.0;
                          dVar124 = 0.0;
                        }
                      }
                      dVar126 = *(double *)(lVar117 + lVar86 * 8);
                      pRVar116[lVar86] = dVar124;
                      pRVar107[lVar86] = dVar125;
                      uVar120 = -(ulong)(0.0 <= dVar126);
                      dVar126 = (double)(~-(ulong)(ABS(dVar126) < 1e-08) & 0x3ff0000000000000);
                      pdVar108[lVar86] =
                           dVar126 * (double)(~uVar120 & (ulong)dVar125 | uVar120 & (ulong)dVar124)
                           + (dVar125 + dVar124) * (1.0 - dVar126) * 0.5;
                      lVar86 = lVar86 + 1;
                    } while (iVar33 != (int)lVar86);
                  }
                  local_460 = local_460 + 1;
                  pdVar54 = pdVar54 + lVar43;
                  pdVar103 = pdVar103 + lVar43;
                  local_470 = local_470 + lVar21;
                  pdVar84 = pdVar84 + lVar21;
                  pRVar107 = pRVar107 + (iVar32 - lVar93);
                  pRVar116 = pRVar116 + (iVar32 - lVar93);
                  lVar117 = lVar117 + lVar27 * 8;
                  pdVar108 = pdVar108 + lVar45;
                  pdVar83 = pdVar83 + lVar94;
                } while (iVar98 != (int)local_460);
              }
              bVar119 = iVar34 != iVar115;
              iVar34 = iVar34 + 1;
              iVar91 = iVar91 + 1;
            } while (bVar119);
          }
          local_4b0 = (double *)((long)local_4b0 + 1);
          local_3d8 = local_3d8 + lVar42;
          local_430 = local_430 + lVar56;
          local_448 = local_448 + lVar56;
          local_450 = local_450 + lVar99;
          local_3c8 = local_3c8 + lVar99;
          local_490 = local_490 + local_a0;
          local_410 = local_410 + lVar101;
        } while (local_4b0 != (double *)uVar122);
      }
    }
  }
  iVar57 = (bx->smallend).vect[2] + -1;
  iVar98 = (bx->bigend).vect[2] + 1;
  local_128 = ybx;
  local_88 = zbx;
  local_58 = qx;
  if (iVar57 <= iVar98) {
    iVar91 = (bx->smallend).vect[1];
    iVar34 = (bx->bigend).vect[1];
    iVar87 = (iVar34 - iVar91) + 3;
    iVar109 = (bx->smallend).vect[0];
    iVar115 = (bx->bigend).vect[0];
    lVar41 = (long)((iVar115 - iVar109) + 3);
    iVar109 = iVar109 + -1;
    iVar115 = iVar115 + 1;
    iVar78 = 0;
    local_16c = ncomp;
    local_50 = bx;
    local_48 = l_dt;
    do {
      if (iVar91 + -1 <= iVar34 + 1) {
        pdVar84 = (double *)((long)iVar78 * iVar87 * lVar41 * 8 + (long)local_180);
        iVar112 = iVar87;
        do {
          if (iVar109 <= iVar115) {
            memset(pdVar84,0,(ulong)(uint)(iVar115 - iVar109) * 8 + 8);
            l_dt = local_48;
          }
          pdVar84 = pdVar84 + lVar41;
          iVar112 = iVar112 + -1;
        } while (iVar112 != 0);
      }
      iVar78 = iVar78 + 1;
      bVar119 = iVar57 != iVar98;
      iVar57 = iVar57 + 1;
    } while (bVar119);
  }
  uVar28 = *(undefined8 *)(xbx->smallend).vect;
  uVar29 = *(undefined8 *)((xbx->smallend).vect + 2);
  aiStack_1ac[1] = (int)((ulong)*(undefined8 *)(xbx->bigend).vect >> 0x20);
  uStack_1a4 = *(undefined8 *)((xbx->bigend).vect + 2);
  iStack_1b0 = (int)uVar29;
  aiStack_1ac[0] = (int)((ulong)uVar29 >> 0x20);
  lVar41 = 0;
  do {
    if ((uStack_1a4._4_4_ >> ((uint)lVar41 & 0x1f) & 1) != 0) {
      aiStack_1ac[lVar41] = aiStack_1ac[lVar41] + -1;
    }
    lVar41 = lVar41 + 1;
  } while (lVar41 != 3);
  local_1b8 = (int)uVar28;
  local_1b8 = local_1b8 + -1;
  iStack_1b4 = (int)((ulong)uVar28 >> 0x20);
  lVar117 = (long)iStack_1b4;
  lVar93 = (long)iStack_1b0;
  iVar91 = aiStack_1ac[1] + 1;
  iVar57 = aiStack_1ac[0] + 2;
  iVar98 = iVar57 - local_1b8;
  lVar41 = (long)iVar98;
  if (iStack_1b0 <= (int)uStack_1a4 + 1) {
    lVar100 = (long)local_1b8;
    lVar42 = (long)iVar49;
    dVar123 = -l_dt / (local_120 * 3.0);
    dVar125 = l_dt / (local_120 * 3.0);
    lVar99 = lVar100 * 8;
    lVar94 = (lVar117 - lVar63) * lVar21;
    lVar71 = lVar99 + lVar94 * 8 + lVar62 * -8;
    lVar80 = lVar99 + (lVar117 - local_140) * lVar24 * 8 + local_138 * -8;
    lVar89 = lVar99 + ((lVar117 + 1) - local_140) * lVar24 * 8 + local_138 * -8;
    lVar101 = lVar99 + (lVar117 - local_c0) * local_130 * 8 + local_b8 * -8;
    lVar56 = lVar99 + ((lVar117 + 1) - local_c0) * local_130 * 8 + local_b8 * -8;
    lVar76 = (lVar38 * lVar37 * 0x10 + lVar52 * lVar39 * 0x10) * lVar36;
    lVar77 = (long)iVar32 * 8 + lVar42 * -8;
    iVar34 = iStack_1b0 + -1;
    lVar55 = lVar24 * 8;
    lVar86 = local_130 * 8;
    iVar109 = iStack_1b0;
    do {
      if (iStack_1b4 <= aiStack_1ac[1]) {
        lVar85 = (long)iVar109;
        pdVar84 = (double *)((lVar85 - lVar93) * lVar41 * (iVar91 - iStack_1b4) * 8 + (long)pdVar26)
        ;
        lVar118 = (long)pdVar97 +
                  (lVar85 - lVar68) * lVar46 * 8 +
                  lVar99 + (lVar117 - lVar67) * lVar27 * 8 + lVar66 * -8;
        lVar104 = (long)pdVar20 + (-lVar64 + lVar85) * lVar22 * 8 + lVar71;
        lVar95 = (long)iVar34;
        lVar74 = (long)pdVar20 + (-lVar64 + lVar95) * lVar22 * 8 + lVar71;
        lVar75 = (-lVar65 + lVar85) * lVar25 * 8;
        lVar72 = (long)pdVar23 + lVar75 + lVar80;
        lVar79 = (-lVar65 + lVar95) * lVar25 * 8;
        lVar73 = (long)pdVar23 + lVar79 + lVar80;
        lVar113 = (long)pdVar23 + lVar75 + lVar89;
        lVar75 = (long)pdVar23 + lVar79 + lVar89;
        lVar79 = (-local_108 + lVar85) * local_100 * 8;
        local_4a8 = (double *)((long)local_b0 + lVar79 + lVar101);
        lVar96 = (lVar95 + -local_108) * local_100 * 8;
        local_4b8 = (long)local_b0 + lVar96 + lVar101;
        lVar95 = (long)local_b0 + lVar79 + lVar56;
        lVar96 = (long)local_b0 + lVar96 + lVar56;
        lVar79 = ((lVar85 - local_168) * lVar39 * 8 + lVar117 * 8 + lVar69 * -8) * lVar38;
        local_468 = (long)p + lVar79 + (lVar76 + lVar39 * lVar38 * local_178 * 8) * lVar53 +
                                       lVar100 * 8 + lVar42 * -8;
        lVar85 = (long)p + lVar79 + lVar76 * lVar53 + lVar100 * 8 + lVar42 * -8;
        lVar79 = lVar117;
        local_4b0 = pdVar20 + (((int)(~uVar13 + iVar8) * lVar22 + lVar94 + lVar100) - lVar62);
        local_480 = pdVar20 + (((int)((iVar50 - uVar13) + 1) * lVar22 + lVar94 + lVar100) - lVar62);
        do {
          if (local_1b8 <= aiStack_1ac[0] + 1) {
            lVar90 = 0;
            do {
              dVar124 = *(double *)(lVar73 + lVar90 * 8);
              dVar126 = *(double *)(lVar72 + lVar90 * 8);
              dVar127 = *(double *)(lVar75 + lVar90 * 8);
              dVar5 = *(double *)(lVar113 + lVar90 * 8);
              dVar124 = *(double *)(lVar85 + lVar90 * 8) +
                        (dVar127 - dVar124) * *(double *)(lVar74 + lVar90 * 8) * dVar125 +
                        (*(double *)(lVar96 + lVar90 * 8) * dVar127 -
                        *(double *)(local_4b8 + lVar90 * 8) * dVar124) * dVar123 + 0.0;
              dVar126 = *(double *)(local_468 + lVar90 * 8) +
                        (dVar5 - dVar126) * *(double *)(lVar104 + lVar90 * 8) * dVar125 +
                        (*(double *)(lVar95 + lVar90 * 8) * dVar5 -
                        *(double *)((long)local_4a8 + lVar90 * 8) * dVar126) * dVar123 + 0.0;
              if (iVar8 < iVar109) {
                if (iVar50 < iVar109) {
                  switch(pbc->bc[5]) {
                  case 0:
                    break;
                  case 1:
                  case 2:
                  case 4:
                    dVar126 = dVar124;
                    break;
                  case 3:
                    dVar126 = local_480[lVar90];
                    break;
                  case -1:
                    dVar124 = 0.0;
                    dVar126 = 0.0;
                    break;
                  default:
                    goto switchD_003a5c24_default;
                  }
                }
              }
              else {
                switch(pbc->bc[2]) {
                case 1:
                case 2:
                case 4:
                  dVar124 = dVar126;
                  break;
                case 3:
                  dVar124 = local_4b0[lVar90];
                  break;
                case -1:
                  dVar124 = 0.0;
                  dVar126 = 0.0;
                }
              }
switchD_003a5c24_default:
              dVar127 = *(double *)(lVar118 + lVar90 * 8);
              uVar122 = -(ulong)(0.0 <= dVar127);
              dVar127 = (double)(~-(ulong)(ABS(dVar127) < 1e-08) & 0x3ff0000000000000);
              pdVar84[lVar90] =
                   dVar127 * (double)(~uVar122 & (ulong)dVar126 | uVar122 & (ulong)dVar124) +
                   (dVar126 + dVar124) * (1.0 - dVar127) * 0.5;
              lVar90 = lVar90 + 1;
            } while (iVar98 != (int)lVar90);
          }
          lVar79 = lVar79 + 1;
          pdVar84 = pdVar84 + (iVar57 - lVar100);
          lVar118 = lVar118 + lVar27 * 8;
          local_480 = local_480 + lVar21;
          local_4b0 = local_4b0 + lVar21;
          lVar104 = lVar104 + lVar21 * 8;
          lVar74 = lVar74 + lVar21 * 8;
          lVar72 = lVar72 + lVar55;
          lVar73 = lVar73 + lVar55;
          lVar113 = lVar113 + lVar55;
          lVar75 = lVar75 + lVar55;
          local_4a8 = (double *)((long)local_4a8 + lVar86);
          local_4b8 = local_4b8 + lVar86;
          lVar95 = lVar95 + lVar86;
          lVar96 = lVar96 + lVar86;
          local_468 = local_468 + lVar77;
          lVar85 = lVar85 + lVar77;
        } while (iVar91 != (int)lVar79);
      }
      iVar34 = iVar34 + 1;
      bVar119 = iVar109 != (int)uStack_1a4 + 1;
      iVar109 = iVar109 + 1;
    } while (bVar119);
  }
  lVar99 = (long)((aiStack_1ac[1] + 2) - iStack_1b4);
  if (iStack_1b0 <= (int)uStack_1a4) {
    lVar76 = (long)local_1b8;
    lVar86 = lVar76 * 8;
    lVar55 = lVar117 + -1;
    lVar71 = lVar86 + (lVar117 - lVar67) * lVar27 * 8 + lVar66 * -8;
    lVar101 = lVar86 + (lVar55 - lVar67) * lVar27 * 8 + lVar66 * -8;
    lVar100 = lVar86 + (lVar117 - local_f8) * lVar45 * 8 + local_f0 * -8;
    lVar94 = lVar86 + (lVar55 - local_f8) * lVar45 * 8 + local_f0 * -8;
    lVar80 = (long)iVar49;
    dVar123 = -l_dt / (local_190 * 3.0);
    dVar125 = l_dt / (local_190 * 3.0);
    lVar77 = (long)iVar32 * 8 + lVar80 * -8;
    lVar42 = lVar27 * 8;
    lVar56 = lVar45 * 8;
    iVar34 = iStack_1b0;
    do {
      iStack_1b0 = iStack_1b0 + 1;
      if (iStack_1b4 <= iVar91) {
        lVar118 = (long)iVar34;
        pdVar84 = (double *)((lVar118 - lVar93) * lVar99 * lVar41 * 8 + (long)local_198);
        lVar79 = (long)pdVar23 +
                 (lVar118 - lVar65) * lVar25 * 8 +
                 lVar86 + (lVar117 - local_140) * lVar24 * 8 + local_138 * -8;
        lVar104 = (lVar118 - lVar64) * lVar22 * 8;
        lVar89 = (long)pdVar20 + lVar104 + lVar86 + (lVar117 - lVar63) * lVar21 * 8 + lVar62 * -8;
        lVar113 = (long)pdVar20 + lVar104 + lVar86 + (lVar55 - lVar63) * lVar21 * 8 + lVar62 * -8;
        lVar75 = (-lVar68 + lVar118) * lVar46 * 8;
        lVar72 = (long)pdVar97 + lVar75 + lVar71;
        lVar73 = (-lVar68 + (long)iStack_1b0) * lVar46 * 8;
        lVar74 = (long)pdVar97 + lVar73 + lVar71;
        lVar85 = (long)pdVar97 + lVar75 + lVar101;
        lVar75 = (long)pdVar97 + lVar73 + lVar101;
        lVar73 = (-lVar40 + lVar118) * lVar47 * 8;
        local_4a8 = (double *)((long)local_e8 + lVar73 + lVar100);
        lVar96 = ((long)iStack_1b0 + -lVar40) * lVar47 * 8;
        local_4b8 = (long)local_e8 + lVar96 + lVar100;
        lVar95 = (long)local_e8 + lVar73 + lVar94;
        lVar96 = (long)local_e8 + lVar96 + lVar94;
        lVar73 = ((lVar118 - lVar70) * lVar37 * 8 + lVar117 * 8 + lVar88 * -8) * lVar38;
        local_468 = (long)p + lVar73 + (lVar52 * lVar39 * 0x10 + lVar38 * lVar37 * 8) *
                                       lVar53 * lVar36 + lVar76 * 8 + lVar80 * -8;
        lVar118 = (long)p + lVar73 + lVar53 * lVar36 * lVar52 * lVar39 * 0x10 + lVar76 * 8 +
                                     lVar80 * -8;
        lVar73 = lVar117;
        do {
          if (local_1b8 <= aiStack_1ac[0] + 1) {
            lVar90 = 0;
            do {
              dVar124 = *(double *)(lVar85 + lVar90 * 8);
              dVar126 = *(double *)(lVar72 + lVar90 * 8);
              dVar127 = *(double *)(lVar75 + lVar90 * 8);
              dVar5 = *(double *)(lVar74 + lVar90 * 8);
              dVar124 = *(double *)(lVar118 + lVar90 * 8) +
                        (dVar127 - dVar124) * *(double *)(lVar113 + lVar90 * 8) * dVar125 +
                        (*(double *)(lVar96 + lVar90 * 8) * dVar127 -
                        *(double *)(lVar95 + lVar90 * 8) * dVar124) * dVar123 + 0.0;
              dVar126 = *(double *)(local_468 + lVar90 * 8) +
                        (dVar5 - dVar126) * *(double *)(lVar89 + lVar90 * 8) * dVar125 +
                        (*(double *)(local_4b8 + lVar90 * 8) * dVar5 -
                        *(double *)((long)local_4a8 + lVar90 * 8) * dVar126) * dVar123 + 0.0;
              if (lVar59 < lVar73) {
                if (lVar35 < lVar73) {
                  switch(pbc->bc[4]) {
                  case 0:
                    break;
                  case 1:
                  case 2:
                  case 4:
                    dVar126 = dVar124;
                    break;
                  case 3:
                    dVar126 = *(double *)
                               ((long)pdVar20 +
                               lVar90 * 8 +
                               lVar104 + lVar86 + (int)((iVar10 - uVar12) + 1) * lVar21 * 8 +
                                         lVar62 * -8);
                    break;
                  case -1:
                    dVar124 = 0.0;
                    dVar126 = 0.0;
                    break;
                  default:
                    goto switchD_003a646d_default;
                  }
                }
              }
              else {
                switch(pbc->bc[1]) {
                case 1:
                case 2:
                case 4:
                  dVar124 = dVar126;
                  break;
                case 3:
                  dVar124 = *(double *)
                             ((long)pdVar20 +
                             lVar90 * 8 +
                             lVar104 + lVar86 + (int)(~uVar12 + iVar6) * lVar21 * 8 + lVar62 * -8);
                  break;
                case -1:
                  dVar124 = 0.0;
                  dVar126 = 0.0;
                }
              }
switchD_003a646d_default:
              dVar127 = *(double *)(lVar79 + lVar90 * 8);
              uVar122 = -(ulong)(0.0 <= dVar127);
              dVar127 = (double)(~-(ulong)(ABS(dVar127) < 1e-08) & 0x3ff0000000000000);
              pdVar84[lVar90] =
                   dVar127 * (double)(~uVar122 & (ulong)dVar126 | uVar122 & (ulong)dVar124) +
                   (dVar126 + dVar124) * (1.0 - dVar127) * 0.5;
              lVar90 = lVar90 + 1;
            } while (iVar98 != (int)lVar90);
          }
          lVar73 = lVar73 + 1;
          pdVar84 = pdVar84 + (iVar57 - lVar76);
          lVar79 = lVar79 + lVar24 * 8;
          lVar89 = lVar89 + lVar21 * 8;
          lVar113 = lVar113 + lVar21 * 8;
          lVar72 = lVar72 + lVar42;
          lVar74 = lVar74 + lVar42;
          lVar85 = lVar85 + lVar42;
          lVar75 = lVar75 + lVar42;
          local_4a8 = (double *)((long)local_4a8 + lVar56);
          local_4b8 = local_4b8 + lVar56;
          lVar95 = lVar95 + lVar56;
          lVar96 = lVar96 + lVar56;
          local_468 = local_468 + lVar77;
          lVar118 = lVar118 + lVar77;
        } while (aiStack_1ac[1] + 2 != (int)lVar73);
      }
      bVar119 = iVar34 != (int)uStack_1a4;
      iVar34 = iVar34 + 1;
    } while (bVar119);
  }
  iVar98 = (xbx->smallend).vect[2];
  iVar34 = (xbx->bigend).vect[2];
  if (iVar98 <= iVar34) {
    iVar109 = (local_58->begin).y;
    iVar115 = (xbx->smallend).vect[1];
    lVar89 = (long)iVar115;
    lVar64 = local_58->jstride;
    iVar78 = (xbx->smallend).vect[0];
    lVar101 = (long)iVar78;
    lVar62 = lVar101 * 8;
    iVar87 = (local_58->begin).x;
    lVar100 = lVar89 * 8 + lVar117 * -8;
    lVar56 = lVar62 + (long)local_1b8 * -8;
    lVar94 = (long)iVar57 * 8 + (long)local_1b8 * -8;
    lVar76 = lVar89 * 8 + lVar69 * -8;
    lVar80 = lVar62 + lVar92 * -8;
    lVar77 = lVar60 * 8 + lVar92 * -8;
    pdVar84 = local_58->p;
    lVar117 = local_58->kstride;
    iVar57 = (local_58->begin).z;
    iVar112 = (xbx->bigend).vect[0];
    iVar33 = (xbx->bigend).vect[1];
    dVar125 = (l_dt * -0.25) / local_120;
    dVar123 = (l_dt * -0.25) / local_190;
    lVar71 = (iVar9 + 1) - lVar101;
    lVar86 = (lVar89 - lVar67) * lVar27 * 8 + lVar62 + lVar66 * -8 + -8;
    lVar42 = lVar56 + -8;
    lVar56 = lVar56 + -8;
    lVar55 = (long)(iVar91 - iStack_1b4) * 8;
    iVar91 = iVar98;
    do {
      iVar98 = iVar98 + 1;
      if (iVar115 <= iVar33) {
        lVar79 = (long)iVar91;
        local_4b8 = (long)pdVar84 +
                    (lVar79 - iVar57) * lVar117 * 8 +
                    (lVar89 - iVar109) * lVar64 * 8 + lVar62 + (long)iVar87 * -8;
        local_4a0 = (double *)
                    ((long)local_150 +
                    (lVar79 - lVar61) * lVar44 * 8 +
                    (lVar89 - local_158) * lVar43 * 8 + lVar62 + local_90 * -8 + -8);
        local_468 = (long)pdVar97 + (-lVar68 + lVar79) * lVar46 * 8 + lVar86;
        lVar96 = (long)pdVar97 + (-lVar68 + (long)iVar98) * lVar46 * 8 + lVar86;
        lVar72 = -lVar93 + lVar79;
        lVar75 = (long)pdVar26 + (lVar55 * lVar72 + lVar100) * lVar41 + lVar56;
        lVar95 = (long)pdVar26 + (((long)iVar98 + -lVar93) * lVar55 + lVar100) * lVar41 + lVar56;
        lVar72 = lVar72 * lVar99 * 8;
        lVar104 = (long)local_198 + (lVar100 + lVar72) * lVar41 + lVar42;
        lVar85 = (long)local_198 + (lVar72 + lVar100 + 8) * lVar41 + lVar42;
        lVar73 = (lVar79 - lVar65) * lVar25 * 8;
        lVar72 = (long)pdVar23 +
                 lVar73 + (lVar89 - local_140) * lVar24 * 8 + lVar62 + local_138 * -8 + -8;
        lVar74 = (long)pdVar23 +
                 lVar73 + ((lVar89 - local_140) + 1) * lVar24 * 8 + lVar62 + local_138 * -8 + -8;
        lVar73 = (long)p + ((lVar53 * lVar36 * 8 + lVar70 * -8 + lVar79 * 8) * lVar39 + lVar76) *
                           lVar52 + lVar80;
        lVar79 = (long)p + ((lVar79 - lVar70) * lVar39 * 8 + lVar76) * lVar52 + lVar80;
        local_4b0 = (double *)lVar89;
        do {
          if (iVar78 <= iVar112) {
            lVar113 = 0;
            do {
              pdVar3 = (double *)(lVar74 + lVar113 * 8);
              pdVar54 = (double *)(lVar72 + lVar113 * 8);
              pdVar83 = (double *)(lVar85 + lVar113 * 8);
              pdVar103 = (double *)(lVar104 + lVar113 * 8);
              pdVar4 = (double *)(lVar96 + lVar113 * 8);
              pdVar108 = (double *)(local_468 + lVar113 * 8);
              pdVar1 = (double *)(lVar95 + lVar113 * 8);
              pdVar2 = (double *)(lVar75 + lVar113 * 8);
              dVar124 = (*pdVar1 - *pdVar2) * (*pdVar108 + *pdVar4) * dVar123 +
                        *(double *)(lVar79 + lVar113 * 8) +
                        (*pdVar83 - *pdVar103) * (*pdVar54 + *pdVar3) * dVar125;
              dVar126 = (pdVar1[1] - pdVar2[1]) * (pdVar108[1] + pdVar4[1]) * dVar123 +
                        *(double *)(lVar73 + lVar113 * 8) +
                        (pdVar83[1] - pdVar103[1]) * (pdVar54[1] + pdVar3[1]) * dVar125;
              if (!l_use_forces_in_trans) {
                pdVar54 = (double *)((long)local_4a0 + lVar113 * 8);
                dVar124 = dVar124 + *pdVar54 * l_dt * 0.5;
                dVar126 = dVar126 + pdVar54[1] * l_dt * 0.5;
              }
              iVar48 = pbc->bc[0];
              iVar82 = pbc->bc[3];
              if (lVar58 - lVar101 == lVar113) {
                switch(iVar48) {
                case 1:
                case 2:
                case 4:
                  dVar124 = dVar126;
                  break;
                case 3:
                  iVar111 = ~uVar11 + iVar102;
LAB_003a6d0c:
                  dVar124 = pdVar20[((long)local_4b0 - lVar63) * lVar21 +
                                    (long)iVar111 + (int)(iVar91 - uVar13) * lVar22];
switchD_003a6ceb_caseD_1:
                  dVar126 = dVar124;
                  break;
                case -1:
switchD_003a6cc4_caseD_ffffffff:
                  dVar124 = 0.0;
                  dVar126 = 0.0;
                }
              }
              else if (lVar71 == lVar113) {
                switch(iVar82) {
                case 1:
                case 2:
                case 4:
                  goto switchD_003a6ceb_caseD_1;
                case 3:
                  iVar111 = (iVar9 + 1) - uVar11;
                  goto LAB_003a6d0c;
                case -1:
                  goto switchD_003a6cc4_caseD_ffffffff;
                }
              }
              dVar127 = dVar126;
              if ((lVar58 - lVar101 == lVar113) &&
                 (((iVar48 == 4 || (iVar48 == 2)) && (dVar124 = 0.0, dVar127 = 0.0, dVar126 <= 0.0))
                 )) {
                dVar124 = dVar126;
                dVar127 = dVar126;
              }
              dVar126 = dVar124;
              if (((lVar71 == lVar113) && ((iVar82 == 4 || (iVar82 == 2)))) &&
                 (dVar126 = 0.0, dVar127 = 0.0, 0.0 <= dVar124)) {
                dVar126 = dVar124;
                dVar127 = dVar124;
              }
              if ((0.0 < dVar126) || (bVar119 = true, dVar127 < 0.0)) {
                bVar119 = ABS(dVar127 + dVar126) < 1e-08;
              }
              uVar122 = 0;
              if (!bVar119) {
                uVar122 = -(ulong)(0.0 <= dVar127 + dVar126);
                uVar122 = ~uVar122 & (ulong)dVar127 | (ulong)dVar126 & uVar122;
              }
              *(ulong *)(local_4b8 + lVar113 * 8) = uVar122;
              lVar113 = lVar113 + 1;
            } while ((iVar112 - iVar78) + 1 != (int)lVar113);
          }
          local_4b0 = (double *)((long)local_4b0 + 1);
          local_4b8 = local_4b8 + lVar64 * 8;
          local_4a0 = (double *)((long)local_4a0 + lVar43 * 8);
          local_468 = local_468 + lVar27 * 8;
          lVar96 = lVar96 + lVar27 * 8;
          lVar75 = lVar75 + lVar94;
          lVar95 = lVar95 + lVar94;
          lVar104 = lVar104 + lVar94;
          lVar85 = lVar85 + lVar94;
          lVar72 = lVar72 + lVar24 * 8;
          lVar74 = lVar74 + lVar24 * 8;
          lVar73 = lVar73 + lVar77;
          lVar79 = lVar79 + lVar77;
        } while (iVar33 + 1 != (int)local_4b0);
      }
      bVar119 = iVar91 != iVar34;
      iVar91 = iVar91 + 1;
    } while (bVar119);
  }
  uVar28 = *(undefined8 *)(local_128->smallend).vect;
  uVar29 = *(undefined8 *)((local_128->smallend).vect + 2);
  aiStack_1ac[1] = (int)((ulong)*(undefined8 *)(local_128->bigend).vect >> 0x20);
  uStack_1a4 = *(undefined8 *)((local_128->bigend).vect + 2);
  iStack_1b0 = (int)uVar29;
  aiStack_1ac[0] = (int)((ulong)uVar29 >> 0x20);
  lVar43 = 0;
  do {
    if ((uStack_1a4._4_4_ >> ((uint)lVar43 & 0x1f) & 1) != 0) {
      aiStack_1ac[lVar43] = aiStack_1ac[lVar43] + -1;
    }
    lVar43 = lVar43 + 1;
  } while (lVar43 != 3);
  iStack_1b4 = (int)((ulong)uVar28 >> 0x20);
  iStack_1b4 = iStack_1b4 + -1;
  local_1b8 = (int)uVar28;
  lVar42 = (long)local_1b8;
  pdVar20 = Ipy->p;
  iVar57 = aiStack_1ac[0] + 2;
  iVar91 = aiStack_1ac[1] + 2;
  lVar63 = (long)(iVar57 - local_1b8);
  lVar64 = (long)(iVar91 - iStack_1b4);
  iVar98 = aiStack_1ac[0] + 1;
  pdVar23 = q->p;
  lVar21 = q->jstride;
  lVar22 = q->kstride;
  lVar24 = q->nstride;
  uVar7 = (q->begin).x;
  lVar65 = (long)(int)uVar7;
  uVar11 = (q->begin).y;
  lVar41 = (long)(int)uVar11;
  uVar12 = (q->begin).z;
  lVar93 = (long)(int)uVar12;
  pdVar84 = u_ad->p;
  lVar25 = u_ad->jstride;
  lVar61 = u_ad->kstride;
  lVar117 = (long)(u_ad->begin).x;
  lVar99 = (long)(u_ad->begin).y;
  lVar55 = (long)(u_ad->begin).z;
  pdVar54 = w_ad->p;
  lVar43 = w_ad->jstride;
  lVar62 = w_ad->kstride;
  lVar56 = (long)(w_ad->begin).x;
  lVar76 = (long)(w_ad->begin).y;
  lVar44 = (long)(w_ad->begin).z;
  lVar86 = (long)iStack_1b0;
  if (iStack_1b0 <= (int)uStack_1a4) {
    lVar94 = (long)iStack_1b4;
    dVar123 = -l_dt / (local_190 * 3.0);
    dVar125 = l_dt / (local_190 * 3.0);
    lVar77 = lVar42 * 8;
    lVar66 = lVar77 + (lVar94 - lVar67) * lVar27 * 8 + lVar66 * -8 + -8;
    lVar67 = local_a0 * 8 + (lVar94 - local_f8) * lVar45 * 8 + lVar42 * 8 + local_f0 * -8 + -8;
    lVar80 = lVar60 * 8 + lVar92 * -8;
    iVar34 = iStack_1b0;
    iVar109 = iStack_1b0;
    do {
      iVar109 = iVar109 + 1;
      if (iStack_1b4 <= aiStack_1ac[1] + 1) {
        lVar100 = (long)iVar34;
        pdVar83 = (double *)((lVar100 - lVar86) * lVar63 * lVar64 * 8 + (long)pdVar20);
        lVar73 = (long)pdVar84 +
                 (lVar100 - lVar55) * lVar61 * 8 +
                 lVar77 + (lVar94 - lVar99) * lVar25 * 8 + lVar117 * -8;
        lVar95 = (long)pdVar23 +
                 (lVar100 - lVar93) * lVar22 * 8 +
                 lVar24 * 8 + (lVar94 - lVar41) * lVar21 * 8 + lVar42 * 8 + lVar65 * -8 + -8;
        lVar74 = (long)pdVar97 + (-lVar68 + lVar100) * lVar46 * 8 + lVar66;
        lVar71 = (long)pdVar97 + (-lVar68 + (long)iVar109) * lVar46 * 8 + lVar66;
        lVar72 = (long)local_e8 + (-lVar40 + lVar100) * lVar47 * 8 + lVar67;
        lVar89 = (long)local_e8 + ((long)iVar109 + -lVar40) * lVar47 * 8 + lVar67;
        lVar75 = (long)p + ((lVar100 - lVar70) * lVar52 * 8 +
                           (lVar60 * 8 + lVar52 * lVar53 * 8 + lVar92 * -8) * lVar36) * lVar39 +
                           lVar77 + (lVar94 - lVar69) * lVar52 * 8 + lVar92 * -8;
        lVar79 = (long)p + ((lVar36 * 8 + lVar70 * -8 + lVar100 * 8) * lVar39 +
                           lVar94 * 8 + lVar69 * -8) * lVar52 + lVar77 + lVar92 * -8;
        lVar101 = (int)(iVar34 - uVar12) * lVar22;
        lVar100 = lVar94;
        do {
          if (local_1b8 <= iVar98) {
            lVar85 = (lVar100 - lVar41) * lVar21;
            lVar96 = 0;
            do {
              pdVar103 = (double *)(lVar89 + lVar96 * 8);
              pdVar108 = (double *)(lVar71 + lVar96 * 8);
              dVar124 = *pdVar108;
              dVar126 = pdVar108[1];
              pdVar108 = (double *)(lVar72 + lVar96 * 8);
              pdVar1 = (double *)(lVar74 + lVar96 * 8);
              dVar127 = *pdVar1;
              dVar5 = pdVar1[1];
              pdVar1 = (double *)(lVar95 + lVar96 * 8);
              dVar124 = *(double *)(lVar79 + lVar96 * 8) +
                        (dVar124 - dVar127) * *pdVar1 * dVar125 +
                        (*pdVar103 * dVar124 - *pdVar108 * dVar127) * dVar123 + 0.0;
              dVar126 = *(double *)(lVar75 + lVar96 * 8) +
                        (dVar126 - dVar5) * pdVar1[1] * dVar125 +
                        (pdVar103[1] * dVar126 - pdVar108[1] * dVar5) * dVar123 + 0.0;
              if (lVar58 < lVar42 + lVar96) {
                if (lVar51 < lVar42 + lVar96) {
                  switch(pbc[1].bc[3]) {
                  case 1:
                  case 2:
                  case 4:
                    dVar126 = dVar124;
                    break;
                  case 3:
                    dVar126 = pdVar23[lVar85 + (long)(int)((iVar9 - uVar7) + 1) + lVar101 + lVar24];
                    break;
                  case -1:
                    goto switchD_003a764d_caseD_ffffffff;
                  }
                }
              }
              else {
                switch(pbc[1].bc[0]) {
                case 1:
                case 2:
                case 4:
                  dVar124 = dVar126;
                  break;
                case 3:
                  dVar124 = pdVar23[lVar85 + (long)(int)(~uVar7 + iVar102) + lVar101 + lVar24];
                  break;
                case -1:
switchD_003a764d_caseD_ffffffff:
                  dVar126 = 0.0;
                  dVar124 = 0.0;
                }
              }
              dVar127 = *(double *)(lVar73 + lVar96 * 8);
              uVar122 = -(ulong)(0.0 <= dVar127);
              dVar127 = (double)(~-(ulong)(ABS(dVar127) < 1e-08) & 0x3ff0000000000000);
              pdVar83[lVar96] =
                   dVar127 * (double)(~uVar122 & (ulong)dVar126 | uVar122 & (ulong)dVar124) +
                   (dVar126 + dVar124) * (1.0 - dVar127) * 0.5;
              lVar96 = lVar96 + 1;
            } while (iVar57 - local_1b8 != (int)lVar96);
          }
          lVar100 = lVar100 + 1;
          pdVar83 = pdVar83 + (iVar57 - lVar42);
          lVar73 = lVar73 + lVar25 * 8;
          lVar95 = lVar95 + lVar21 * 8;
          lVar74 = lVar74 + lVar27 * 8;
          lVar71 = lVar71 + lVar27 * 8;
          lVar72 = lVar72 + lVar45 * 8;
          lVar89 = lVar89 + lVar45 * 8;
          lVar75 = lVar75 + lVar80;
          lVar79 = lVar79 + lVar80;
        } while (iVar91 != (int)lVar100);
      }
      bVar119 = iVar34 != (int)uStack_1a4;
      iVar34 = iVar34 + 1;
    } while (bVar119);
  }
  lVar45 = (long)(iVar98 - local_1b8);
  if (iStack_1b0 <= (int)uStack_1a4 + 1) {
    lVar68 = (long)iStack_1b4;
    lVar77 = (long)iVar49;
    dVar123 = -l_dt / (local_160 * 3.0);
    dVar125 = l_dt / (local_160 * 3.0);
    lVar66 = (lVar68 - lVar41) * lVar21;
    lVar67 = lVar24 * 8 + lVar66 * 8 + lVar42 * 8 + lVar65 * -8;
    lVar40 = (lVar38 * lVar37 * 0x10 + lVar52 * lVar39 * 0x10) * lVar36;
    lVar46 = (long)iVar32 * 8 + lVar77 * -8;
    lVar47 = lVar42 * 8 + (lVar68 - lVar99) * lVar25 * 8 + lVar117 * -8 + 8;
    lVar27 = local_d8 * 8 + (lVar68 - local_e0) * local_148 * 8 + lVar42 * 8 + local_d0 * -8 + 8;
    iVar34 = iStack_1b0 + -1;
    do {
      if (iStack_1b4 <= aiStack_1ac[1] + 1) {
        lVar80 = (long)iStack_1b0;
        pdVar97 = (double *)((lVar80 - lVar86) * lVar64 * lVar45 * 8 + (long)pdVar26);
        lVar71 = (long)pdVar54 +
                 (lVar80 - lVar44) * lVar62 * 8 +
                 lVar42 * 8 + (lVar68 - lVar76) * lVar43 * 8 + lVar56 * -8;
        lVar101 = (long)pdVar23 + (-lVar93 + lVar80) * lVar22 * 8 + lVar67;
        lVar72 = (long)iVar34;
        lVar89 = (long)pdVar23 + (-lVar93 + lVar72) * lVar22 * 8 + lVar67;
        lVar94 = (long)pdVar84 + (-lVar55 + lVar80) * lVar61 * 8 + lVar47;
        lVar73 = (long)pdVar84 + (-lVar55 + lVar72) * lVar61 * 8 + lVar47;
        lVar100 = (long)local_c8 + (-local_118 + lVar80) * local_110 * 8 + lVar27;
        lVar79 = (long)local_c8 + (lVar72 + -local_118) * local_110 * 8 + lVar27;
        lVar72 = ((local_178 * 8 + local_168 * -8 + lVar80 * 8) * lVar39 + lVar68 * 8 + lVar69 * -8)
                 * lVar38;
        lVar80 = (long)p + lVar72 + (lVar40 + lVar39 * lVar38 * local_178 * 8) * lVar53 + lVar42 * 8
                                    + lVar77 * -8;
        lVar72 = (long)p + lVar72 + lVar40 * lVar53 + lVar42 * 8 + lVar77 * -8;
        local_4a8 = pdVar23 + (((int)(~uVar12 + iVar8) * lVar22 + lVar42 + lVar66 + lVar24) - lVar65
                              );
        local_4a0 = pdVar23 + (((int)((iVar50 - uVar12) + 1) * lVar22 + lVar42 + lVar66 + lVar24) -
                              lVar65);
        local_468 = lVar68;
        do {
          if (local_1b8 <= aiStack_1ac[0]) {
            lVar74 = 0;
            do {
              dVar124 = *(double *)(lVar73 + -8 + lVar74 * 8);
              dVar126 = *(double *)(lVar73 + lVar74 * 8);
              dVar127 = *(double *)(lVar94 + -8 + lVar74 * 8);
              dVar5 = *(double *)(lVar94 + lVar74 * 8);
              dVar124 = *(double *)(lVar72 + lVar74 * 8) +
                        (dVar126 - dVar124) * *(double *)(lVar89 + lVar74 * 8) * dVar125 +
                        (*(double *)(lVar79 + lVar74 * 8) * dVar126 -
                        *(double *)(lVar79 + -8 + lVar74 * 8) * dVar124) * dVar123 + 0.0;
              dVar126 = *(double *)(lVar80 + lVar74 * 8) +
                        (dVar5 - dVar127) * *(double *)(lVar101 + lVar74 * 8) * dVar125 +
                        (*(double *)(lVar100 + lVar74 * 8) * dVar5 -
                        *(double *)(lVar100 + -8 + lVar74 * 8) * dVar127) * dVar123 + 0.0;
              if (iVar8 < iStack_1b0) {
                if (iVar50 < iStack_1b0) {
                  switch(pbc[1].bc[5]) {
                  case 1:
                  case 2:
                  case 4:
                    dVar126 = dVar124;
                    break;
                  case 3:
                    dVar126 = local_4a0[lVar74];
                    break;
                  case -1:
                    goto switchD_003a7dce_caseD_ffffffff;
                  }
                  goto switchD_003a7dce_caseD_0;
                }
              }
              else {
                switch(pbc[1].bc[2]) {
                case 1:
                case 2:
                case 4:
                  dVar124 = dVar126;
                  break;
                case 3:
                  dVar124 = local_4a8[lVar74];
                  break;
                case -1:
switchD_003a7dce_caseD_ffffffff:
                  dVar126 = 0.0;
                  dVar124 = 0.0;
                }
switchD_003a7dce_caseD_0:
              }
              dVar127 = *(double *)(lVar71 + lVar74 * 8);
              uVar122 = -(ulong)(0.0 <= dVar127);
              dVar127 = (double)(~-(ulong)(ABS(dVar127) < 1e-08) & 0x3ff0000000000000);
              pdVar97[lVar74] =
                   dVar127 * (double)(~uVar122 & (ulong)dVar126 | uVar122 & (ulong)dVar124) +
                   (dVar126 + dVar124) * (1.0 - dVar127) * 0.5;
              lVar74 = lVar74 + 1;
            } while (iVar98 - local_1b8 != (int)lVar74);
          }
          local_468 = local_468 + 1;
          pdVar97 = pdVar97 + (iVar98 - lVar42);
          lVar71 = lVar71 + lVar43 * 8;
          local_4a0 = local_4a0 + lVar21;
          local_4a8 = local_4a8 + lVar21;
          lVar101 = lVar101 + lVar21 * 8;
          lVar89 = lVar89 + lVar21 * 8;
          lVar94 = lVar94 + lVar25 * 8;
          lVar73 = lVar73 + lVar25 * 8;
          lVar100 = lVar100 + local_148 * 8;
          lVar79 = lVar79 + local_148 * 8;
          lVar80 = lVar80 + lVar46;
          lVar72 = lVar72 + lVar46;
        } while (iVar91 != (int)local_468);
      }
      iVar34 = iVar34 + 1;
      bVar119 = iStack_1b0 != (int)uStack_1a4 + 1;
      iStack_1b0 = iStack_1b0 + 1;
    } while (bVar119);
  }
  pdVar97 = f->p;
  lVar27 = f->jstride;
  lVar40 = f->kstride;
  lVar46 = f->nstride;
  lVar66 = (long)(f->begin).x;
  lVar67 = (long)(f->begin).y;
  lVar47 = (long)(f->begin).z;
  iVar91 = (local_128->smallend).vect[2];
  iVar34 = (local_128->bigend).vect[2];
  if (iVar91 <= iVar34) {
    iVar109 = (local_128->smallend).vect[0];
    lVar75 = (long)iVar109;
    iVar48 = iVar10 + 1;
    iVar115 = (qy->begin).y;
    iVar78 = (local_128->smallend).vect[1];
    lVar79 = (long)iVar78;
    lVar94 = qy->jstride;
    lVar77 = lVar75 * 8;
    iVar87 = (qy->begin).x;
    lVar80 = lVar46 * 8;
    lVar68 = lVar79 + -1;
    lVar72 = lVar77 + (lVar79 - lVar76) * lVar43 * 8 + lVar56 * -8;
    lVar100 = lVar77 + (lVar68 - lVar76) * lVar43 * 8 + lVar56 * -8;
    lVar74 = lVar79 * 8 + (long)iStack_1b4 * -8;
    lVar56 = lVar77 + lVar42 * -8;
    lVar101 = (long)iVar98 * 8 + lVar42 * -8;
    lVar71 = (long)iVar57 * 8 + lVar42 * -8;
    lVar89 = lVar38 * lVar37;
    lVar73 = (long)iVar49;
    lVar76 = (long)iVar32 * 8 + lVar73 * -8;
    pdVar83 = qy->p;
    lVar42 = qy->kstride;
    iVar57 = (qy->begin).z;
    iVar98 = (local_128->bigend).vect[0];
    iVar112 = (local_128->bigend).vect[1];
    dVar125 = (l_dt * -0.25) / local_160;
    dVar123 = (l_dt * -0.25) / local_190;
    lVar62 = lVar62 * 8;
    lVar44 = -lVar44;
    lVar43 = lVar43 * 8;
    iVar33 = iVar91;
    do {
      iVar91 = iVar91 + 1;
      if (iVar78 <= iVar112) {
        lVar104 = (long)iVar33;
        local_4b8 = (long)pdVar83 +
                    (lVar104 - iVar57) * lVar42 * 8 +
                    lVar77 + (lVar79 - iVar115) * lVar94 * 8 + (long)iVar87 * -8;
        lVar95 = (lVar104 - lVar47) * lVar40 * 8;
        local_480 = (double *)
                    ((long)pdVar97 +
                    lVar95 + lVar80 + (lVar79 - lVar67) * lVar27 * 8 + lVar75 * 8 + lVar66 * -8);
        local_478 = (long)pdVar97 +
                    lVar95 + lVar80 + (lVar68 - lVar67) * lVar27 * 8 + lVar75 * 8 + lVar66 * -8;
        lVar85 = (lVar44 + lVar104) * lVar62;
        local_460 = (long)pdVar54 + lVar85 + lVar72;
        lVar95 = (lVar44 + iVar91) * lVar62;
        local_4b0 = (double *)((long)pdVar54 + lVar95 + lVar72);
        local_468 = (long)pdVar54 + lVar85 + lVar100;
        local_4a0 = (double *)((long)pdVar54 + lVar95 + lVar100);
        lVar85 = (-lVar86 + lVar104) * lVar64 * 8;
        lVar95 = lVar74 + -8 + lVar85;
        local_470 = (double *)((long)pdVar26 + lVar45 * lVar95 + lVar56);
        lVar96 = ((long)iVar91 + -lVar86) * lVar64 * 8;
        lVar118 = (long)pdVar26 + (lVar74 + -8 + lVar96) * lVar45 + lVar56;
        lVar85 = lVar85 + lVar74;
        lVar110 = (long)pdVar26 + lVar45 * lVar85 + lVar56;
        lVar106 = (long)pdVar26 + (lVar96 + lVar74) * lVar45 + lVar56;
        lVar105 = (long)pdVar20 + lVar85 * lVar63 + lVar56 + 8;
        lVar90 = (long)pdVar20 + lVar95 * lVar63 + lVar56 + 8;
        lVar85 = (lVar104 - lVar55) * lVar61 * 8;
        lVar95 = (long)pdVar84 + lVar85 + lVar77 + (lVar79 - lVar99) * lVar25 * 8 + lVar117 * -8 + 8
        ;
        lVar114 = (long)pdVar84 +
                  lVar85 + lVar77 + (lVar68 - lVar99) * lVar25 * 8 + lVar117 * -8 + 8;
        lVar96 = ((lVar104 - lVar70) * lVar37 * 8 + lVar79 * 8 + lVar88 * -8) * lVar38;
        lVar85 = (long)p + lVar96 + ((lVar52 * lVar39 * 0x10 + lVar89 * 8) * lVar53 + lVar89 * 8) *
                                    lVar36 + lVar75 * 8 + lVar73 * -8;
        lVar113 = (long)p + lVar96 + (lVar52 * lVar39 * lVar53 * 0x10 + lVar89 * 8) * lVar36 +
                                     lVar75 * 8 + lVar73 * -8;
        lVar96 = lVar79;
        do {
          if (iVar109 <= iVar98) {
            lVar81 = 0;
            do {
              dVar124 = (*(double *)(lVar118 + lVar81 * 8) -
                        *(double *)((long)local_470 + lVar81 * 8)) *
                        (*(double *)(local_468 + lVar81 * 8) +
                        *(double *)((long)local_4a0 + lVar81 * 8)) * dVar123 +
                        *(double *)(lVar113 + lVar81 * 8) +
                        (*(double *)(lVar90 + lVar81 * 8) - *(double *)(lVar90 + -8 + lVar81 * 8)) *
                        (*(double *)(lVar114 + -8 + lVar81 * 8) + *(double *)(lVar114 + lVar81 * 8))
                        * dVar125;
              dVar126 = (*(double *)(lVar106 + lVar81 * 8) - *(double *)(lVar110 + lVar81 * 8)) *
                        (*(double *)(local_460 + lVar81 * 8) +
                        *(double *)((long)local_4b0 + lVar81 * 8)) * dVar123 +
                        *(double *)(lVar85 + lVar81 * 8) +
                        (*(double *)(lVar105 + lVar81 * 8) - *(double *)(lVar105 + -8 + lVar81 * 8))
                        * (*(double *)(lVar95 + -8 + lVar81 * 8) + *(double *)(lVar95 + lVar81 * 8))
                          * dVar125;
              if (!l_use_forces_in_trans) {
                dVar124 = dVar124 + *(double *)(local_478 + lVar81 * 8) * l_dt * 0.5;
                dVar126 = dVar126 + *(double *)((long)local_480 + lVar81 * 8) * l_dt * 0.5;
              }
              iVar82 = pbc[1].bc[1];
              iVar111 = pbc[1].bc[4];
              if (lVar96 == lVar59) {
                switch(iVar82) {
                case 1:
                case 2:
                case 4:
                  dVar124 = dVar126;
                  break;
                case 3:
                  lVar30 = lVar24 * 8 + (int)(~uVar11 + iVar6) * lVar21 * 8 + lVar75 * 8 +
                           lVar65 * -8;
LAB_003a8819:
                  dVar124 = *(double *)
                             ((long)pdVar23 + lVar81 * 8 + (lVar104 - lVar93) * lVar22 * 8 + lVar30)
                  ;
switchD_003a87ff_caseD_1:
                  dVar126 = dVar124;
                  break;
                case -1:
switchD_003a87d7_caseD_ffffffff:
                  dVar124 = 0.0;
                  dVar126 = 0.0;
                }
              }
              else if (lVar96 == iVar48) {
                switch(iVar111) {
                case 1:
                case 2:
                case 4:
                  goto switchD_003a87ff_caseD_1;
                case 3:
                  lVar30 = lVar24 * 8 + (int)(iVar48 - uVar11) * lVar21 * 8 + lVar75 * 8 +
                           lVar65 * -8;
                  goto LAB_003a8819;
                case -1:
                  goto switchD_003a87d7_caseD_ffffffff;
                }
              }
              dVar127 = dVar126;
              if ((lVar96 == lVar59) &&
                 (((iVar82 == 4 || (iVar82 == 2)) && (dVar124 = 0.0, dVar127 = 0.0, dVar126 <= 0.0))
                 )) {
                dVar124 = dVar126;
                dVar127 = dVar126;
              }
              dVar126 = dVar124;
              if (((lVar96 == iVar48) && ((iVar111 == 4 || (iVar111 == 2)))) &&
                 (dVar126 = 0.0, dVar127 = 0.0, 0.0 <= dVar124)) {
                dVar126 = dVar124;
                dVar127 = dVar124;
              }
              if ((0.0 < dVar126) || (bVar119 = true, dVar127 < 0.0)) {
                bVar119 = ABS(dVar127 + dVar126) < 1e-08;
              }
              uVar122 = 0;
              if (!bVar119) {
                uVar122 = -(ulong)(0.0 <= dVar127 + dVar126);
                uVar122 = ~uVar122 & (ulong)dVar127 | (ulong)dVar126 & uVar122;
              }
              *(ulong *)(local_4b8 + lVar81 * 8) = uVar122;
              lVar81 = lVar81 + 1;
            } while ((iVar98 - iVar109) + 1 != (int)lVar81);
          }
          lVar96 = lVar96 + 1;
          local_4b8 = local_4b8 + lVar94 * 8;
          local_480 = (double *)((long)local_480 + lVar27 * 8);
          local_478 = local_478 + lVar27 * 8;
          local_460 = local_460 + lVar43;
          local_4b0 = (double *)((long)local_4b0 + lVar43);
          local_468 = local_468 + lVar43;
          local_4a0 = (double *)((long)local_4a0 + lVar43);
          local_470 = (double *)((long)local_470 + lVar101);
          lVar118 = lVar118 + lVar101;
          lVar110 = lVar110 + lVar101;
          lVar106 = lVar106 + lVar101;
          lVar105 = lVar105 + lVar71;
          lVar90 = lVar90 + lVar71;
          lVar95 = lVar95 + lVar25 * 8;
          lVar114 = lVar114 + lVar25 * 8;
          lVar85 = lVar85 + lVar76;
          lVar113 = lVar113 + lVar76;
        } while (iVar112 + 1 != (int)lVar96);
      }
      bVar119 = iVar33 != iVar34;
      iVar33 = iVar33 + 1;
    } while (bVar119);
  }
  uVar28 = *(undefined8 *)(local_88->smallend).vect;
  uVar29 = *(undefined8 *)((local_88->smallend).vect + 2);
  aiStack_1ac[1] = (int)((ulong)*(undefined8 *)(local_88->bigend).vect >> 0x20);
  uStack_1a4 = *(undefined8 *)((local_88->bigend).vect + 2);
  iStack_1b0 = (int)uVar29;
  aiStack_1ac[0] = (int)((ulong)uVar29 >> 0x20);
  lVar45 = 0;
  do {
    if ((uStack_1a4._4_4_ >> ((uint)lVar45 & 0x1f) & 1) != 0) {
      aiStack_1ac[lVar45] = aiStack_1ac[lVar45] + -1;
    }
    lVar45 = lVar45 + 1;
  } while (lVar45 != 3);
  uStack_1a4._0_4_ = (int)uStack_1a4 + 1;
  local_1b8 = (int)uVar28;
  lVar56 = (long)local_1b8;
  iStack_1b4 = (int)((ulong)uVar28 >> 0x20);
  lVar68 = (long)iStack_1b4;
  iVar57 = aiStack_1ac[0] + 2;
  iVar34 = aiStack_1ac[1] + 1;
  lVar63 = (long)(iVar57 - local_1b8);
  pdVar26 = Ipz->p;
  iVar98 = aiStack_1ac[0] + 1;
  lVar64 = (long)(iVar98 - local_1b8);
  lVar62 = (long)((aiStack_1ac[1] + 2) - iStack_1b4);
  pdVar54 = v_ad->p;
  lVar45 = v_ad->jstride;
  lVar44 = v_ad->kstride;
  lVar86 = (long)(v_ad->begin).x;
  lVar42 = (long)(v_ad->begin).y;
  lVar43 = (long)(v_ad->begin).z;
  iVar91 = iStack_1b0 + -1;
  if (iVar91 <= (int)uStack_1a4) {
    lVar76 = lVar56 * 8;
    lVar71 = lVar76 + (lVar68 - lVar42) * lVar45 * 8 + lVar86 * -8;
    lVar89 = lVar60 * 8 + lVar92 * -8;
    dVar123 = -l_dt / (local_120 * 3.0);
    dVar125 = l_dt / (local_120 * 3.0);
    lVar72 = lVar76 + (lVar68 - lVar99) * lVar25 * 8 + lVar117 * -8;
    lVar73 = lVar24 * 0x10;
    lVar79 = lVar73 + (lVar68 - lVar41) * lVar21 * 8 + lVar56 * 8 + lVar65 * -8;
    lVar101 = -lVar43;
    lVar77 = lVar25 * 8;
    lVar80 = lVar21 * 8;
    lVar94 = lVar44 * 8;
    lVar100 = lVar45 * 8;
    iVar109 = iVar91;
    do {
      if (iStack_1b4 <= aiStack_1ac[1]) {
        lVar95 = (long)iVar109;
        pdVar83 = (double *)
                  ((-(long)iVar91 + lVar95) * lVar63 * (iVar34 - iStack_1b4) * 8 + (long)pdVar20);
        lVar85 = (long)pdVar84 + (-lVar55 + lVar95) * lVar61 * 8 + lVar72;
        lVar105 = (long)pdVar23 + (-lVar93 + lVar95) * lVar22 * 8 + lVar79 + -8;
        lVar75 = (lVar101 + lVar95) * lVar94;
        lVar74 = (long)pdVar54 + lVar75 + lVar71 + -8;
        lVar118 = (long)pdVar54 +
                  lVar75 + lVar76 + ((lVar68 + 1) - lVar42) * lVar45 * 8 + lVar86 * -8 + -8;
        lVar96 = (lVar95 - local_108) * local_100 * 8;
        lVar75 = (long)local_b0 +
                 lVar96 + local_98 * 0x10 + (lVar68 - local_c0) * local_130 * 8 + lVar56 * 8 +
                          local_b8 * -8 + -8;
        lVar104 = (long)local_b0 +
                  lVar96 + local_98 * 0x10 + ((lVar68 + 1) - local_c0) * local_130 * 8 + lVar56 * 8
                           + local_b8 * -8 + -8;
        lVar113 = (long)p + ((-lVar70 + lVar95) * lVar52 * 8 +
                            (lVar60 * 0x10 + lVar52 * lVar53 * 8 + lVar92 * -0x10) * lVar36) *
                            lVar39 + lVar76 + (lVar68 - lVar69) * lVar52 * 8 + lVar92 * -8;
        lVar90 = (long)p + ((lVar36 * 0x10 + lVar70 * -8 + lVar95 * 8) * lVar39 +
                           lVar68 * 8 + lVar69 * -8) * lVar52 + lVar76 + lVar92 * -8;
        lVar96 = (int)(iVar109 - uVar12) * lVar22;
        lVar95 = lVar68;
        do {
          if (local_1b8 <= iVar98) {
            lVar106 = (lVar95 - lVar41) * lVar21;
            lVar110 = 0;
            do {
              pdVar103 = (double *)(lVar104 + lVar110 * 8);
              pdVar108 = (double *)(lVar118 + lVar110 * 8);
              dVar124 = *pdVar108;
              dVar126 = pdVar108[1];
              pdVar108 = (double *)(lVar75 + lVar110 * 8);
              pdVar1 = (double *)(lVar74 + lVar110 * 8);
              dVar127 = *pdVar1;
              dVar5 = pdVar1[1];
              pdVar1 = (double *)(lVar105 + lVar110 * 8);
              dVar124 = *(double *)(lVar90 + lVar110 * 8) +
                        (dVar124 - dVar127) * *pdVar1 * dVar125 +
                        (*pdVar103 * dVar124 - *pdVar108 * dVar127) * dVar123 + 0.0;
              dVar126 = *(double *)(lVar113 + lVar110 * 8) +
                        (dVar126 - dVar5) * pdVar1[1] * dVar125 +
                        (pdVar103[1] * dVar126 - pdVar108[1] * dVar5) * dVar123 + 0.0;
              if (lVar58 < lVar56 + lVar110) {
                if (lVar51 < lVar56 + lVar110) {
                  switch(pbc[2].bc[3]) {
                  case 1:
                  case 2:
                  case 4:
                    dVar126 = dVar124;
                    break;
                  case 3:
                    dVar126 = pdVar23[lVar106 + (long)(int)((iVar9 - uVar7) + 1) +
                                                lVar96 + lVar24 * 2];
                    break;
                  case -1:
                    goto switchD_003a91a4_caseD_ffffffff;
                  }
                }
              }
              else {
                switch(pbc[2].bc[0]) {
                case 1:
                case 2:
                case 4:
                  dVar124 = dVar126;
                  break;
                case 3:
                  dVar124 = pdVar23[lVar106 + (long)(int)(~uVar7 + iVar102) + lVar96 + lVar24 * 2];
                  break;
                case -1:
switchD_003a91a4_caseD_ffffffff:
                  dVar126 = 0.0;
                  dVar124 = 0.0;
                }
              }
              dVar127 = *(double *)(lVar85 + lVar110 * 8);
              uVar122 = -(ulong)(0.0 <= dVar127);
              dVar127 = (double)(~-(ulong)(ABS(dVar127) < 1e-08) & 0x3ff0000000000000);
              pdVar83[lVar110] =
                   dVar127 * (double)(~uVar122 & (ulong)dVar126 | uVar122 & (ulong)dVar124) +
                   (dVar126 + dVar124) * (1.0 - dVar127) * 0.5;
              lVar110 = lVar110 + 1;
            } while (iVar57 - local_1b8 != (int)lVar110);
          }
          lVar95 = lVar95 + 1;
          pdVar83 = pdVar83 + (iVar57 - lVar56);
          lVar85 = lVar85 + lVar77;
          lVar105 = lVar105 + lVar80;
          lVar74 = lVar74 + lVar100;
          lVar118 = lVar118 + lVar100;
          lVar75 = lVar75 + local_130 * 8;
          lVar104 = lVar104 + local_130 * 8;
          lVar113 = lVar113 + lVar89;
          lVar90 = lVar90 + lVar89;
        } while (iVar34 != (int)lVar95);
      }
      bVar119 = iVar109 != (int)uStack_1a4;
      iVar109 = iVar109 + 1;
    } while (bVar119);
    if (iVar91 <= (int)uStack_1a4) {
      lVar58 = lVar68 + -1;
      lVar51 = (long)iVar49;
      dVar123 = -l_dt / (local_160 * 3.0);
      dVar125 = l_dt / (local_160 * 3.0);
      lVar60 = lVar38 * lVar37 * 0x10;
      lVar92 = (long)iVar32 * 8 + lVar51 * -8;
      iVar102 = iVar91;
      do {
        if (iStack_1b4 <= iVar34) {
          lVar85 = (long)iVar102;
          pdVar83 = (double *)((-(long)iVar91 + lVar85) * lVar62 * lVar64 * 8 + (long)pdVar26);
          lVar90 = (long)pdVar54 + (lVar101 + lVar85) * lVar94 + lVar71;
          lVar113 = (-lVar93 + lVar85) * lVar22 * 8;
          lVar89 = (long)pdVar23 + lVar113 + lVar79;
          lVar118 = (long)pdVar23 +
                    lVar113 + lVar73 + (lVar58 - lVar41) * lVar21 * 8 + lVar56 * 8 + lVar65 * -8;
          lVar75 = (-lVar55 + lVar85) * lVar61 * 8;
          lVar74 = (long)pdVar84 + lVar75 + lVar72 + 8;
          lVar104 = (long)pdVar84 +
                    lVar75 + lVar76 + (lVar58 - lVar99) * lVar25 * 8 + lVar117 * -8 + 8;
          lVar95 = (lVar85 - local_118) * local_110 * 8;
          lVar75 = (long)local_c8 +
                   lVar95 + local_d8 * 0x10 + (lVar68 - local_e0) * local_148 * 8 + lVar56 * 8 +
                            local_d0 * -8 + 8;
          lVar96 = (long)local_c8 +
                   lVar95 + local_d8 * 0x10 + (lVar58 - local_e0) * local_148 * 8 + lVar56 * 8 +
                            local_d0 * -8 + 8;
          lVar85 = ((lVar85 + -lVar70) * lVar37 * 8 + lVar68 * 8 + lVar88 * -8) * lVar38;
          lVar95 = (long)p + lVar85 + ((lVar52 * lVar39 * 0x10 + lVar38 * lVar37 * 8) * lVar53 +
                                      lVar60) * lVar36 + lVar56 * 8 + lVar51 * -8;
          lVar105 = (long)p + lVar85 + (lVar52 * lVar39 * lVar53 * 0x10 + lVar60) * lVar36 +
                                       lVar56 * 8 + lVar51 * -8;
          lVar85 = lVar68;
          do {
            if (local_1b8 <= aiStack_1ac[0]) {
              lVar106 = 0;
              do {
                dVar124 = *(double *)(lVar104 + -8 + lVar106 * 8);
                dVar126 = *(double *)(lVar104 + lVar106 * 8);
                dVar127 = *(double *)(lVar74 + -8 + lVar106 * 8);
                dVar5 = *(double *)(lVar74 + lVar106 * 8);
                dVar124 = *(double *)(lVar105 + lVar106 * 8) +
                          (dVar126 - dVar124) * *(double *)(lVar118 + lVar106 * 8) * dVar125 +
                          (*(double *)(lVar96 + lVar106 * 8) * dVar126 -
                          *(double *)(lVar96 + -8 + lVar106 * 8) * dVar124) * dVar123 + 0.0;
                dVar126 = *(double *)(lVar95 + lVar106 * 8) +
                          (dVar5 - dVar127) * *(double *)(lVar89 + lVar106 * 8) * dVar125 +
                          (*(double *)(lVar75 + lVar106 * 8) * dVar5 -
                          *(double *)(lVar75 + -8 + lVar106 * 8) * dVar127) * dVar123 + 0.0;
                if (lVar59 < lVar85) {
                  if (lVar35 < lVar85) {
                    switch(pbc[2].bc[4]) {
                    case 1:
                    case 2:
                    case 4:
                      dVar126 = dVar124;
                      break;
                    case 3:
                      dVar126 = *(double *)
                                 ((long)pdVar23 +
                                 lVar106 * 8 +
                                 lVar113 + lVar73 + (int)((iVar10 - uVar11) + 1) * lVar21 * 8 +
                                           lVar56 * 8 + lVar65 * -8);
                      break;
                    case -1:
                      goto switchD_003a97a5_caseD_ffffffff;
                    }
                  }
                }
                else {
                  switch(pbc[2].bc[1]) {
                  case 1:
                  case 2:
                  case 4:
                    dVar124 = dVar126;
                    break;
                  case 3:
                    dVar124 = *(double *)
                               ((long)pdVar23 +
                               lVar106 * 8 +
                               lVar113 + lVar73 + (int)(~uVar11 + iVar6) * lVar21 * 8 + lVar56 * 8 +
                                         lVar65 * -8);
                    break;
                  case -1:
switchD_003a97a5_caseD_ffffffff:
                    dVar126 = 0.0;
                    dVar124 = 0.0;
                  }
                }
                dVar127 = *(double *)(lVar90 + lVar106 * 8);
                uVar122 = -(ulong)(0.0 <= dVar127);
                dVar127 = (double)(~-(ulong)(ABS(dVar127) < 1e-08) & 0x3ff0000000000000);
                pdVar83[lVar106] =
                     dVar127 * (double)(~uVar122 & (ulong)dVar126 | uVar122 & (ulong)dVar124) +
                     (dVar126 + dVar124) * (1.0 - dVar127) * 0.5;
                lVar106 = lVar106 + 1;
              } while (iVar98 - local_1b8 != (int)lVar106);
            }
            lVar85 = lVar85 + 1;
            pdVar83 = pdVar83 + (iVar98 - lVar56);
            lVar90 = lVar90 + lVar100;
            lVar89 = lVar89 + lVar80;
            lVar118 = lVar118 + lVar80;
            lVar74 = lVar74 + lVar77;
            lVar104 = lVar104 + lVar77;
            lVar75 = lVar75 + local_148 * 8;
            lVar96 = lVar96 + local_148 * 8;
            lVar95 = lVar95 + lVar92;
            lVar105 = lVar105 + lVar92;
          } while (aiStack_1ac[1] + 2 != (int)lVar85);
        }
        bVar119 = iVar102 != (int)uStack_1a4;
        iVar102 = iVar102 + 1;
      } while (bVar119);
    }
  }
  iVar102 = (local_88->smallend).vect[2];
  iVar6 = (local_88->bigend).vect[2];
  if (iVar102 <= iVar6) {
    iVar9 = (local_88->smallend).vect[1];
    lVar76 = (long)iVar9;
    iVar50 = iVar50 + 1;
    lVar60 = (lVar76 - lVar41) * lVar21;
    iVar10 = (local_88->smallend).vect[0];
    lVar93 = (long)iVar10;
    iVar109 = (qz->begin).y;
    lVar59 = qz->jstride;
    lVar58 = lVar93 * 8;
    iVar115 = (qz->begin).x;
    lVar70 = lVar46 * 0x10 + (lVar76 - lVar67) * lVar27 * 8 + lVar93 * 8 + lVar66 * -8;
    lVar88 = lVar58 + (lVar76 - lVar42) * lVar45 * 8 + lVar86 * -8;
    lVar41 = lVar58 + ((lVar76 - lVar42) + 1) * lVar45 * 8 + lVar86 * -8;
    lVar92 = lVar76 * 8 + lVar68 * -8;
    iStack_1b0 = iVar102 - iStack_1b0;
    lVar66 = lVar58 + lVar56 * -8;
    lVar67 = (long)iVar98 * 8 + lVar56 * -8;
    lVar68 = (long)iVar57 * 8 + lVar56 * -8;
    lVar46 = lVar58 + (lVar76 - lVar99) * lVar25 * 8 + lVar117 * -8 + 8;
    lVar36 = (lVar37 * lVar38 * 0x10 + lVar52 * lVar39 * 0x10) * lVar36;
    lVar52 = (long)iVar49;
    lVar37 = (long)iVar32 * 8 + lVar52 * -8;
    pdVar83 = qz->p;
    lVar35 = qz->kstride;
    iVar98 = (qz->begin).z;
    iVar78 = (local_88->bigend).vect[0];
    iVar87 = (local_88->bigend).vect[1];
    dVar125 = (l_dt * -0.25) / local_160;
    dVar123 = (l_dt * -0.25) / local_120;
    lVar40 = lVar40 * 8;
    lVar47 = -lVar47;
    lVar44 = lVar44 * 8;
    lVar43 = -lVar43;
    lVar45 = lVar45 * 8;
    lVar62 = lVar62 * 8;
    lVar51 = (long)(iVar34 - iStack_1b4) * 8;
    iVar57 = iVar102 + -1;
    do {
      if (iVar9 <= iVar87) {
        lVar117 = (long)iVar102;
        local_2a0 = (long)pdVar83 +
                    (lVar117 - iVar98) * lVar35 * 8 +
                    lVar58 + (lVar76 - iVar109) * lVar59 * 8 + (long)iVar115 * -8;
        local_468 = (long)pdVar97 + (lVar47 + lVar117) * lVar40 + lVar70;
        lVar77 = (long)iVar57;
        local_460 = (long)pdVar97 + (lVar47 + lVar77) * lVar40 + lVar70;
        lVar86 = (lVar43 + lVar117) * lVar44;
        local_260 = (long)pdVar54 + lVar86 + lVar88;
        lVar99 = (lVar43 + lVar77) * lVar44;
        local_218 = (long)pdVar54 + lVar99 + lVar88;
        local_2c0 = (long)pdVar54 + lVar86 + lVar41;
        local_268 = (long)pdVar54 + lVar99 + lVar41;
        lVar99 = lVar62 * (lVar117 - iVar91);
        local_4a8 = (double *)((long)pdVar26 + (lVar92 + 8 + lVar99) * lVar64 + lVar66);
        lVar86 = lVar62 * iStack_1b0;
        lVar56 = (long)pdVar26 + (lVar92 + 8 + lVar86) * lVar64 + lVar66;
        lVar94 = (long)pdVar26 + (lVar99 + lVar92) * lVar64 + lVar66;
        lVar101 = (long)pdVar26 + (lVar86 + lVar92) * lVar64 + lVar66;
        lVar80 = (long)pdVar20 + ((lVar117 - iVar91) * lVar51 + lVar92) * lVar63 + lVar66 + 8;
        lVar100 = (long)pdVar20 + (iStack_1b0 * lVar51 + lVar92) * lVar63 + lVar66 + 8;
        lVar42 = (long)pdVar84 + (-lVar55 + lVar117) * lVar61 * 8 + lVar46;
        lVar77 = (long)pdVar84 + (lVar77 + -lVar55) * lVar61 * 8 + lVar46;
        lVar99 = ((local_178 * 0x10 + local_168 * -8 + lVar117 * 8) * lVar39 +
                 lVar76 * 8 + lVar69 * -8) * lVar38;
        lVar117 = (long)p + lVar99 + (lVar36 + lVar39 * lVar38 * local_178 * 8) * lVar53 +
                                     lVar93 * 8 + lVar52 * -8;
        lVar86 = (long)p + lVar99 + lVar36 * lVar53 + lVar93 * 8 + lVar52 * -8;
        lVar99 = lVar76;
        local_4b0 = pdVar23 + ((lVar93 + lVar24 * 2 + lVar60 + (int)(iVar50 - uVar12) * lVar22) -
                              lVar65);
        local_270 = pdVar23 + ((lVar93 + lVar24 * 2 + lVar60 + (int)(~uVar12 + iVar8) * lVar22) -
                              lVar65);
        do {
          if (iVar10 <= iVar78) {
            lVar71 = 0;
            do {
              dVar124 = (*(double *)(lVar56 + lVar71 * 8) - *(double *)(lVar101 + lVar71 * 8)) *
                        (*(double *)(local_218 + lVar71 * 8) + *(double *)(local_268 + lVar71 * 8))
                        * dVar123 +
                        *(double *)(lVar86 + lVar71 * 8) +
                        (*(double *)(lVar100 + lVar71 * 8) - *(double *)(lVar100 + -8 + lVar71 * 8))
                        * (*(double *)(lVar77 + -8 + lVar71 * 8) + *(double *)(lVar77 + lVar71 * 8))
                          * dVar125;
              dVar126 = (*(double *)((long)local_4a8 + lVar71 * 8) -
                        *(double *)(lVar94 + lVar71 * 8)) *
                        (*(double *)(local_260 + lVar71 * 8) + *(double *)(local_2c0 + lVar71 * 8))
                        * dVar123 +
                        *(double *)(lVar117 + lVar71 * 8) +
                        (*(double *)(lVar80 + lVar71 * 8) - *(double *)(lVar80 + -8 + lVar71 * 8)) *
                        (*(double *)(lVar42 + -8 + lVar71 * 8) + *(double *)(lVar42 + lVar71 * 8)) *
                        dVar125;
              if (!l_use_forces_in_trans) {
                dVar124 = dVar124 + *(double *)(local_460 + lVar71 * 8) * l_dt * 0.5;
                dVar126 = dVar126 + *(double *)(local_468 + lVar71 * 8) * l_dt * 0.5;
              }
              iVar34 = pbc[2].bc[2];
              iVar112 = pbc[2].bc[5];
              if (iVar8 == iVar102) {
                switch(iVar34) {
                case 1:
                case 2:
                case 4:
                  dVar124 = dVar126;
                  break;
                case 3:
                  pdVar103 = local_270;
LAB_003aa0cd:
                  dVar124 = pdVar103[lVar71];
switchD_003aa0b6_caseD_1:
                  dVar126 = dVar124;
                  break;
                case -1:
switchD_003aa08e_caseD_ffffffff:
                  dVar124 = 0.0;
                  dVar126 = 0.0;
                }
              }
              else if (iVar50 == iVar102) {
                switch(iVar112) {
                case 1:
                case 2:
                case 4:
                  goto switchD_003aa0b6_caseD_1;
                case 3:
                  pdVar103 = local_4b0;
                  goto LAB_003aa0cd;
                case -1:
                  goto switchD_003aa08e_caseD_ffffffff;
                }
              }
              dVar127 = dVar126;
              if ((iVar8 == iVar102) &&
                 (((iVar34 == 4 || (iVar34 == 2)) && (dVar124 = 0.0, dVar127 = 0.0, dVar126 <= 0.0))
                 )) {
                dVar124 = dVar126;
                dVar127 = dVar126;
              }
              dVar126 = dVar124;
              if (((iVar50 == iVar102) && ((iVar112 == 4 || (iVar112 == 2)))) &&
                 (dVar126 = 0.0, dVar127 = 0.0, 0.0 <= dVar124)) {
                dVar126 = dVar124;
                dVar127 = dVar124;
              }
              if ((0.0 < dVar126) || (bVar119 = true, dVar127 < 0.0)) {
                bVar119 = ABS(dVar127 + dVar126) < 1e-08;
              }
              uVar122 = 0;
              if (!bVar119) {
                uVar122 = -(ulong)(0.0 <= dVar127 + dVar126);
                uVar122 = ~uVar122 & (ulong)dVar127 | (ulong)dVar126 & uVar122;
              }
              *(ulong *)(local_2a0 + lVar71 * 8) = uVar122;
              lVar71 = lVar71 + 1;
            } while ((iVar78 - iVar10) + 1 != (int)lVar71);
          }
          lVar99 = lVar99 + 1;
          local_270 = local_270 + lVar21;
          local_4b0 = local_4b0 + lVar21;
          local_2a0 = local_2a0 + lVar59 * 8;
          local_468 = local_468 + lVar27 * 8;
          local_460 = local_460 + lVar27 * 8;
          local_260 = local_260 + lVar45;
          local_218 = local_218 + lVar45;
          local_2c0 = local_2c0 + lVar45;
          local_268 = local_268 + lVar45;
          local_4a8 = (double *)((long)local_4a8 + lVar67);
          lVar56 = lVar56 + lVar67;
          lVar94 = lVar94 + lVar67;
          lVar101 = lVar101 + lVar67;
          lVar80 = lVar80 + lVar68;
          lVar100 = lVar100 + lVar68;
          lVar42 = lVar42 + lVar25 * 8;
          lVar77 = lVar77 + lVar25 * 8;
          lVar117 = lVar117 + lVar37;
          lVar86 = lVar86 + lVar37;
        } while (iVar87 + 1 != (int)lVar99);
      }
      iVar57 = iVar57 + 1;
      iStack_1b0 = iStack_1b0 + 1;
      bVar119 = iVar102 != iVar6;
      iVar102 = iVar102 + 1;
    } while (bVar119);
  }
  return;
}

Assistant:

void
Godunov::ExtrapVelToFacesOnBox ( Box const& bx, int ncomp,
                                 Box const& xbx,
                                 Box const& ybx,
                                 Box const& zbx,
                                 Array4<Real> const& qx,
                                 Array4<Real> const& qy,
                                 Array4<Real> const& qz,
                                 Array4<Real const> const& q,
                                 Array4<Real const> const& u_ad,
                                 Array4<Real const> const& v_ad,
                                 Array4<Real const> const& w_ad,
                                 Array4<Real> const& Imx,
                                 Array4<Real> const& Imy,
                                 Array4<Real> const& Imz,
                                 Array4<Real> const& Ipx,
                                 Array4<Real> const& Ipy,
                                 Array4<Real> const& Ipz,
                                 Array4<Real const> const& f,
                                 const Box& domain,
                                 const Real* dx_arr,
                                 Real l_dt,
                                 BCRec  const* pbc,
                                 bool l_use_forces_in_trans,
                                 Real* p)
{

    const Dim3 dlo = amrex::lbound(domain);
    const Dim3 dhi = amrex::ubound(domain);

    Real dx = dx_arr[0];
    Real dy = dx_arr[1];
    Real dz = dx_arr[2];

    Box xebox = Box(bx).grow(1,1).grow(2,1).surroundingNodes(0);
    Box yebox = Box(bx).grow(0,1).grow(2,1).surroundingNodes(1);
    Box zebox = Box(bx).grow(0,1).grow(1,1).surroundingNodes(2);

    Array4<Real> xlo = makeArray4(p, xebox, ncomp);
    p += xlo.size();
    Array4<Real> xhi = makeArray4(p, xebox, ncomp);
    p += xhi.size();
    Array4<Real> ylo = makeArray4(p, yebox, ncomp);
    p += ylo.size();
    Array4<Real> yhi = makeArray4(p, yebox, ncomp);
    p += yhi.size();
    Array4<Real> zlo = makeArray4(p, zebox, ncomp);
    p += zlo.size();
    Array4<Real> zhi = makeArray4(p, zebox, ncomp);
    p += zhi.size();

    amrex::ParallelFor(
    xebox, ncomp, [=] AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
    {
        Real lo = Ipx(i-1,j,k,n);
        Real hi = Imx(i  ,j,k,n);

        if (l_use_forces_in_trans)
        {
            lo += 0.5*l_dt*f(i-1,j,k,n);
            hi += 0.5*l_dt*f(i  ,j,k,n);
        }

        Real uad = u_ad(i,j,k);
        auto bc = pbc[n];

        GodunovTransBC::SetTransTermXBCs(i, j, k, n, q, lo, hi, bc.lo(0), bc.hi(0), dlo.x, dhi.x, true);

        xlo(i,j,k,n) = lo;
        xhi(i,j,k,n) = hi;

        Real st = (uad >= 0.) ? lo : hi;
        Real fu = (amrex::Math::abs(uad) < small_vel) ? 0.0 : 1.0;
        Imx(i, j, k, n) = fu*st + (1.0 - fu) *0.5 * (hi + lo); // store xedge
    },
    yebox, ncomp, [=] AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
    {
        Real lo = Ipy(i,j-1,k,n);
        Real hi = Imy(i,j  ,k,n);

        if (l_use_forces_in_trans)
        {
            lo += 0.5*l_dt*f(i,j-1,k,n);
            hi += 0.5*l_dt*f(i,j  ,k,n);
        }

        Real vad = v_ad(i,j,k);
        auto bc = pbc[n];

        GodunovTransBC::SetTransTermYBCs(i, j, k, n, q, lo, hi, bc.lo(1), bc.hi(1), dlo.y, dhi.y, true);

        ylo(i,j,k,n) = lo;
        yhi(i,j,k,n) = hi;

        Real st = (vad >= 0.) ? lo : hi;
        Real fu = (amrex::Math::abs(vad) < small_vel) ? 0.0 : 1.0;
        Imy(i, j, k, n) = fu*st + (1.0 - fu)*0.5*(hi + lo); // store yedge
    },
    zebox, ncomp, [=] AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
    {

        Real lo = Ipz(i,j,k-1,n);
        Real hi = Imz(i,j,k  ,n);

        if (l_use_forces_in_trans)
        {
            lo += 0.5*l_dt*f(i,j,k-1,n);
            hi += 0.5*l_dt*f(i,j,k  ,n);
        }

        Real wad = w_ad(i,j,k);
        auto bc = pbc[n];

        GodunovTransBC::SetTransTermZBCs(i, j, k, n, q, lo, hi, bc.lo(2), bc.hi(2), dlo.z, dhi.z, true);

        zlo(i,j,k,n) = lo;
        zhi(i,j,k,n) = hi;

        Real st = (wad >= 0.) ? lo : hi;
        Real fu = (amrex::Math::abs(wad) < small_vel) ? 0.0 : 1.0;
        Imz(i, j, k, n) = fu*st + (1.0 - fu)*0.5*(hi + lo); // store zedge
    }
    );


    Array4<Real> xedge = Imx;
    Array4<Real> yedge = Imy;
    Array4<Real> zedge = Imz;

    Array4<Real> divu = makeArray4(Ipx.dataPtr(), grow(bx,1), 1);
    amrex::ParallelFor(Box(divu), [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept {
        divu(i,j,k) = 0.0;
    });

    //
    // X-Flux
    //
    Box const xbxtmp = Box(xbx).enclosedCells().grow(0,1);
    Array4<Real> yzlo = makeArray4(Ipy.dataPtr(), amrex::surroundingNodes(xbxtmp,1), 1);
    Array4<Real> zylo = makeArray4(Ipz.dataPtr(), amrex::surroundingNodes(xbxtmp,2), 1);

    // Add d/dy term to z-faces
    // Start with {zlo,zhi} --> {zylo, zyhi} and upwind using w_ad to {zylo}
    // Add d/dz to y-faces
    // Start with {ylo,yhi} --> {yzlo, yzhi} and upwind using v_ad to {yzlo}
    amrex::ParallelFor(Box(zylo), Box(yzlo),
    [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
    {
        constexpr int n = 0;
        const auto bc = pbc[n];
        Real l_zylo, l_zyhi;
        GodunovCornerCouple::AddCornerCoupleTermZY(l_zylo, l_zyhi,
                              i, j, k, n, l_dt, dy, false,
                              zlo(i,j,k,n), zhi(i,j,k,n),
                              q, divu, v_ad, yedge);

        Real wad = w_ad(i,j,k);
        GodunovTransBC::SetTransTermZBCs(i, j, k, n, q, l_zylo, l_zyhi, bc.lo(2), bc.hi(2), dlo.z, dhi.z, true);


        Real st = (wad >= 0.) ? l_zylo : l_zyhi;
        Real fu = (amrex::Math::abs(wad) < small_vel) ? 0.0 : 1.0;
        zylo(i,j,k) = fu*st + (1.0 - fu) * 0.5 * (l_zyhi + l_zylo);
    },
    [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
    {
        constexpr int n = 0;
        const auto bc = pbc[n];
        Real l_yzlo, l_yzhi;
        GodunovCornerCouple::AddCornerCoupleTermYZ(l_yzlo, l_yzhi,
                              i, j, k, n, l_dt, dz, false,
                              ylo(i,j,k,n), yhi(i,j,k,n),
                              q, divu, w_ad, zedge);

        Real vad = v_ad(i,j,k);
        GodunovTransBC::SetTransTermYBCs(i, j, k, n, q, l_yzlo, l_yzhi, bc.lo(1), bc.hi(1), dlo.y, dhi.y, true);

        Real st = (vad >= 0.) ? l_yzlo : l_yzhi;
        Real fu = (amrex::Math::abs(vad) < small_vel) ? 0.0 : 1.0;
        yzlo(i,j,k) = fu*st + (1.0 - fu) * 0.5 * (l_yzhi + l_yzlo);
    });

    //
    amrex::ParallelFor(xbx, [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
    {
        constexpr int n = 0;
        auto bc = pbc[n];

        Real stl = xlo(i,j,k,n) - (0.25*l_dt/dy)*(v_ad(i-1,j+1,k  )+v_ad(i-1,j,k))*
                                                 (yzlo(i-1,j+1,k  )-yzlo(i-1,j,k))
                                - (0.25*l_dt/dz)*(w_ad(i-1,j  ,k+1)+w_ad(i-1,j,k))*
                                                 (zylo(i-1,j  ,k+1)-zylo(i-1,j,k));
        Real sth = xhi(i,j,k,n) - (0.25*l_dt/dy)*(v_ad(i  ,j+1,k  )+v_ad(i  ,j,k))*
                                                 (yzlo(i  ,j+1,k  )-yzlo(i  ,j,k))
                                - (0.25*l_dt/dz)*(w_ad(i  ,j  ,k+1)+w_ad(i  ,j,k))*
                                                 (zylo(i  ,j  ,k+1)-zylo(i  ,j,k));

        if (!l_use_forces_in_trans)
        {
            stl += 0.5 * l_dt * f(i-1,j,k,n);
            sth += 0.5 * l_dt * f(i  ,j,k,n);
        }

        HydroBC::SetXEdgeBCs(i, j, k, n, q, stl, sth, bc.lo(0), dlo.x, bc.hi(0), dhi.x, true);

        if ( (i==dlo.x) && (bc.lo(0) == BCType::foextrap || bc.lo(0) == BCType::hoextrap) )
        {
            sth = amrex::min(sth,0.0_rt);
            stl = sth;
        }
        if ( (i==dhi.x+1) && (bc.hi(0) == BCType::foextrap || bc.hi(0) == BCType::hoextrap) )
        {
             stl = amrex::max(stl,0.0_rt);
             sth = stl;
        }

        Real st = ( (stl+sth) >= 0.) ? stl : sth;
        bool ltm = ( (stl <= 0. && sth >= 0.) || (amrex::Math::abs(stl+sth) < small_vel) );
        qx(i,j,k) = ltm ? 0. : st;
    });

    //
    // Y-Flux
    //
    Box const ybxtmp = Box(ybx).enclosedCells().grow(1,1);
    Array4<Real> xzlo = makeArray4(Ipy.dataPtr(), amrex::surroundingNodes(ybxtmp,0), 1);
    Array4<Real> zxlo = makeArray4(Ipz.dataPtr(), amrex::surroundingNodes(ybxtmp,2), 1);

    // Add d/dz to x-faces
    // Start with {xlo,xhi} --> {xzlo, xzhi} and upwind using u_ad to {xzlo}
    // Add d/dx term to z-faces
    // Start with {zlo,zhi} --> {zxlo, zxhi} and upwind using w_ad to {zxlo}
    amrex::ParallelFor(Box(xzlo), Box(zxlo),
    [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
    {
        constexpr int n = 1;
        const auto bc = pbc[n];
        Real l_xzlo, l_xzhi;
        GodunovCornerCouple::AddCornerCoupleTermXZ(l_xzlo, l_xzhi,
                              i, j, k, n, l_dt, dz, false,
                              xlo(i,j,k,n),  xhi(i,j,k,n),
                              q, divu, w_ad, zedge);

        Real uad = u_ad(i,j,k);
        GodunovTransBC::SetTransTermXBCs(i, j, k, n, q, l_xzlo, l_xzhi, bc.lo(0), bc.hi(0), dlo.x, dhi.x, true);


        Real st = (uad >= 0.) ? l_xzlo : l_xzhi;
        Real fu = (amrex::Math::abs(uad) < small_vel) ? 0.0 : 1.0;
        xzlo(i,j,k) = fu*st + (1.0 - fu) * 0.5 * (l_xzhi + l_xzlo);
    },
    [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
    {
        constexpr int n = 1;
        const auto bc = pbc[n];
        Real l_zxlo, l_zxhi;
        GodunovCornerCouple::AddCornerCoupleTermZX(l_zxlo, l_zxhi,
                              i, j, k, n, l_dt, dx, false,
                              zlo(i,j,k,n), zhi(i,j,k,n),
                              q, divu, u_ad, xedge);

        Real wad = w_ad(i,j,k);
        GodunovTransBC::SetTransTermZBCs(i, j, k, n, q, l_zxlo, l_zxhi, bc.lo(2), bc.hi(2), dlo.z, dhi.z, true);

        Real st = (wad >= 0.) ? l_zxlo : l_zxhi;
        Real fu = (amrex::Math::abs(wad) < small_vel) ? 0.0 : 1.0;
        zxlo(i,j,k) = fu*st + (1.0 - fu) * 0.5 * (l_zxhi + l_zxlo);
    });

    //
    amrex::ParallelFor(ybx, [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
    {
        constexpr int n = 1;
        auto bc = pbc[n];

        Real stl = ylo(i,j,k,n) - (0.25*l_dt/dx)*(u_ad(i+1,j-1,k  )+u_ad(i,j-1,k))*
                                                 (xzlo(i+1,j-1,k  )-xzlo(i,j-1,k))
                                - (0.25*l_dt/dz)*(w_ad(i  ,j-1,k+1)+w_ad(i,j-1,k))*
                                                 (zxlo(i  ,j-1,k+1)-zxlo(i,j-1,k));
        Real sth = yhi(i,j,k,n) - (0.25*l_dt/dx)*(u_ad(i+1,j  ,k  )+u_ad(i,j  ,k))*
                                                 (xzlo(i+1,j  ,k  )-xzlo(i,j  ,k))
                                - (0.25*l_dt/dz)*(w_ad(i  ,j  ,k+1)+w_ad(i,j  ,k))*
                                                 (zxlo(i  ,j  ,k+1)-zxlo(i,j  ,k));


        if (!l_use_forces_in_trans)
        {
           stl += 0.5 * l_dt * f(i,j-1,k,n);
           sth += 0.5 * l_dt * f(i,j  ,k,n);
        }

        HydroBC::SetYEdgeBCs(i, j, k, n, q, stl, sth, bc.lo(1), dlo.y, bc.hi(1), dhi.y, true);

        if ( (j==dlo.y) && (bc.lo(1) == BCType::foextrap || bc.lo(1) == BCType::hoextrap) )
        {
            sth = amrex::min(sth,0.0_rt);
            stl = sth;
        }
        if ( (j==dhi.y+1) && (bc.hi(1) == BCType::foextrap || bc.hi(1) == BCType::hoextrap) )
        {
            stl = amrex::max(stl,0.0_rt);
            sth = stl;
        }

        Real st = ( (stl+sth) >= 0.) ? stl : sth;
        bool ltm = ( (stl <= 0. && sth >= 0.) || (amrex::Math::abs(stl+sth) < small_vel) );
        qy(i,j,k) = ltm ? 0. : st;
    });


    //
    // Z-Flux
    //
    Box const zbxtmp = Box(zbx).enclosedCells().grow(2,1);
    Array4<Real> xylo = makeArray4(Ipy.dataPtr(), amrex::surroundingNodes(zbxtmp,0), 1);
    Array4<Real> yxlo = makeArray4(Ipz.dataPtr(), amrex::surroundingNodes(zbxtmp,1), 1);

    amrex::ParallelFor(Box(xylo), Box(yxlo),
    //
    // Add d/dy term to x-faces
    // Start with {xlo,xhi} --> {xylo, xyhi} and upwind using u_ad to {xylo}
    //
    [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
    {
        constexpr int n = 2;
        const auto bc = pbc[n];
        Real l_xylo, l_xyhi;
        GodunovCornerCouple::AddCornerCoupleTermXY(l_xylo, l_xyhi,
                              i, j, k, n, l_dt, dy, false,
                              xlo(i,j,k,n), xhi(i,j,k,n),
                              q, divu, v_ad, yedge);

        Real uad = u_ad(i,j,k);
        GodunovTransBC::SetTransTermXBCs(i, j, k, n, q, l_xylo, l_xyhi, bc.lo(0), bc.hi(0), dlo.x, dhi.x, true);


        Real st = (uad >= 0.) ? l_xylo : l_xyhi;
        Real fu = (amrex::Math::abs(uad) < small_vel) ? 0.0 : 1.0;
        xylo(i,j,k) = fu*st + (1.0 - fu) * 0.5 * (l_xyhi + l_xylo);
    },
    //
    // Add d/dx term to y-faces
    // Start with {ylo,yhi} --> {yxlo, yxhi} and upwind using v_ad to {yxlo}
    //
    [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
    {
        constexpr int n = 2;
        const auto bc = pbc[n];
        Real l_yxlo, l_yxhi;
        GodunovCornerCouple::AddCornerCoupleTermYX(l_yxlo, l_yxhi,
                              i, j, k, n, l_dt, dx, false,
                              ylo(i,j,k,n), yhi(i,j,k,n),
                              q, divu, u_ad, xedge);

        Real vad = v_ad(i,j,k);
        GodunovTransBC::SetTransTermYBCs(i, j, k, n, q, l_yxlo, l_yxhi, bc.lo(1), bc.hi(1), dlo.y, dhi.y, true);


        Real st = (vad >= 0.) ? l_yxlo : l_yxhi;
        Real fu = (amrex::Math::abs(vad) < small_vel) ? 0.0 : 1.0;
        yxlo(i,j,k) = fu*st + (1.0 - fu) * 0.5 * (l_yxhi + l_yxlo);
    });
    //
    amrex::ParallelFor(zbx, [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
    {
        constexpr int n = 2;
        auto bc = pbc[n];
        Real stl = zlo(i,j,k,n) - (0.25*l_dt/dx)*(u_ad(i+1,j  ,k-1)+u_ad(i,j,k-1))*
                                                 (xylo(i+1,j  ,k-1)-xylo(i,j,k-1))
                                - (0.25*l_dt/dy)*(v_ad(i  ,j+1,k-1)+v_ad(i,j,k-1))*
                                                 (yxlo(i  ,j+1,k-1)-yxlo(i,j,k-1));
        Real sth = zhi(i,j,k,n) - (0.25*l_dt/dx)*(u_ad(i+1,j  ,k  )+u_ad(i,j,k  ))*
                                                 (xylo(i+1,j  ,k  )-xylo(i,j,k  ))
                                - (0.25*l_dt/dy)*(v_ad(i  ,j+1,k  )+v_ad(i,j,k  ))*
                                                 (yxlo(i  ,j+1,k  )-yxlo(i,j,k  ));

        if (!l_use_forces_in_trans)
        {
           stl += 0.5 * l_dt * f(i,j,k-1,n);
           sth += 0.5 * l_dt * f(i,j,k  ,n);
        }

        HydroBC::SetZEdgeBCs(i, j, k, n, q, stl, sth, bc.lo(2), dlo.z, bc.hi(2), dhi.z, true);

        if ( (k==dlo.z) && (bc.lo(2) == BCType::foextrap || bc.lo(2) == BCType::hoextrap) )
        {
            sth = amrex::min(sth,0.0_rt);
            stl = sth;
        }
        if ( (k==dhi.z+1) && (bc.hi(2) == BCType::foextrap || bc.hi(2) == BCType::hoextrap) )
        {
            stl = amrex::max(stl,0.0_rt);
            sth = stl;
        }

        Real st = ( (stl+sth) >= 0.) ? stl : sth;
        bool ltm = ( (stl <= 0. && sth >= 0.) || (amrex::Math::abs(stl+sth) < small_vel) );
        qz(i,j,k) = ltm ? 0. : st;
    });
}